

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  _func_int *p_Var12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  int *piVar24;
  undefined1 auVar25 [32];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  float *pfVar54;
  int iVar55;
  long lVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  float *pfVar62;
  long lVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  undefined4 *puVar67;
  float *pfVar68;
  float *pfVar69;
  ulong uVar70;
  undefined4 *puVar71;
  int iVar72;
  ulong uVar73;
  undefined1 auVar78 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar79 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar110 [28];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar120;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar159 [32];
  __m128 pos;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar192;
  undefined1 auVar193 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  undefined1 auVar194 [32];
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 (*local_218) [32];
  int local_210;
  long local_200;
  int local_1f8;
  long local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  int local_198;
  int local_138;
  Mat local_88;
  ulong local_38;
  undefined1 auVar118 [32];
  
  uVar31 = bottom_blob->elemsize;
  iVar7 = bottom_blob->elempack;
  p_Var12 = this->_vptr_Convolution1D_x86_avx[-3];
  iVar8 = *(int *)(&this->field_0xd4 + (long)p_Var12);
  iVar9 = *(int *)(&this->field_0xd8 + (long)p_Var12);
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)((long)&this->_vptr_Convolution1D_x86_avx + (long)p_Var12),bottom_blob
             ,&local_88,opt);
  local_198 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    uVar46 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx[-3]);
    if (opt->use_packing_layout == true) {
      lVar60 = (ulong)((uVar46 & 3) == 0) * 3 + 1;
      if ((uVar46 & 7) == 0) {
        lVar60 = 8;
      }
    }
    else {
      lVar60 = 1;
    }
    Mat::create(top_blob,(local_88.w + ~((iVar8 + -1) * iVar9)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_avx[-3]) +
                         1,(int)uVar46 / (int)lVar60,lVar60 * (uVar31 / (ulong)(long)iVar7),
                (int)lVar60,opt->blob_allocator);
    iVar7 = local_88.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var12 = this->_vptr_Convolution1D_x86_avx[-3];
      iVar8 = *(int *)(&this->field_0xd8 + (long)p_Var12);
      lVar49 = (long)iVar8;
      iVar9 = *(int *)(&this->field_0xdc + (long)p_Var12);
      iVar10 = *(int *)(&this->field_0xf4 + (long)p_Var12);
      lVar56 = (long)local_88.elempack;
      lVar41 = (long)local_88.h;
      iVar39 = local_88.w * local_88.elempack;
      local_38 = (ulong)top_blob->w;
      uVar30 = (long)top_blob->h * (long)top_blob->elempack;
      lVar63 = (long)top_blob->elempack * local_38;
      lVar60 = *(long *)(&this->field_0x190 + (long)p_Var12);
      iVar53 = (int)uVar30;
      uVar31 = (long)((ulong)(uint)(iVar53 >> 0x1f) << 0x20 | uVar30 & 0xffffffff) / 8;
      iVar26 = iVar8 * 8;
      lVar48 = (long)iVar39;
      lVar42 = (long)(iVar8 * 4);
      iVar23 = iVar39 * 2;
      iVar8 = iVar39 * 3;
      iVar27 = iVar39 * 4;
      iVar18 = iVar39 * 5;
      iVar28 = iVar39 * 6;
      iVar39 = iVar39 * 7;
      iVar40 = (int)lVar63;
      uVar64 = 0;
      uVar73 = (ulong)*(uint *)(&this->field_0xd4 + (long)p_Var12);
      if ((int)*(uint *)(&this->field_0xd4 + (long)p_Var12) < 1) {
        uVar73 = uVar64;
      }
      iVar52 = (int)uVar31;
      uVar57 = 0;
      if (0 < iVar52) {
        uVar57 = uVar31 & 0xffffffff;
      }
      lVar50 = lVar49 * 4;
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar186 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar147._8_4_ = 0x3f800000;
      auVar147._0_8_ = 0x3f8000003f800000;
      auVar147._12_4_ = 0x3f800000;
      auVar147._16_4_ = 0x3f800000;
      auVar147._20_4_ = 0x3f800000;
      auVar147._24_4_ = 0x3f800000;
      auVar147._28_4_ = 0x3f800000;
      lVar1 = (long)iVar9 * 4;
      auVar173._8_4_ = 0x3f800000;
      auVar173._0_8_ = 0x3f8000003f800000;
      auVar173._12_4_ = 0x3f800000;
      for (; iVar72 = (int)uVar73, uVar64 != uVar57; uVar64 = uVar64 + 1) {
        uVar46 = top_blob->w;
        iVar72 = top_blob->elempack;
        local_218 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar64 * 8) >> 0x1f) << 0x20 |
                                       uVar64 * 8 & 0xffffffff) / (long)iVar72) * (long)(int)uVar46
                     * top_blob->elemsize + (long)top_blob->data);
        lVar58 = (long)local_88.h * (long)local_88.elempack;
        local_200 = 0;
        uVar31 = 0;
        if (0 < (int)uVar46) {
          uVar31 = (ulong)uVar46;
        }
        iVar51 = 0;
        local_1d8 = lVar48 * 4;
        for (uVar70 = 0; uVar70 != uVar31; uVar70 = uVar70 + 1) {
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar148 = 0.0;
          fVar152 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar209 = 0.0;
          if (lVar60 != 0) {
            pfVar54 = (float *)(lVar60 + uVar64 * 0x20);
            fVar202 = *pfVar54;
            fVar203 = pfVar54[1];
            fVar204 = pfVar54[2];
            fVar205 = pfVar54[3];
            fVar206 = pfVar54[4];
            fVar207 = pfVar54[5];
            fVar208 = pfVar54[6];
            fVar209 = pfVar54[7];
          }
          pfVar54 = (float *)((this->weight_data_tm).cstep * uVar64 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar29 = local_88.elempack * iVar9 * (int)uVar70;
          lVar43 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar65 = (long)local_88.data + local_1d8;
          pfVar69 = (float *)((long)local_88.data + local_200);
          uVar59 = 0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar80 = 0.0;
          fVar95 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          fVar100 = 0.0;
          fVar101 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar192 = 0.0;
          fVar195 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          while( true ) {
            local_210 = (int)lVar58;
            if (local_210 <= (int)((uint)uVar59 | 7)) break;
            lVar32 = (int)((long)((ulong)(uint)((int)(uint)uVar59 >> 0x1f) << 0x20 |
                                 uVar59 & 0xffffffff) / (long)local_88.elempack) * lVar43;
            if (local_88.elempack == 8) {
              pfVar33 = (float *)((long)local_88.data + lVar32 + (long)iVar51 * 4);
              pfVar37 = pfVar54;
              uVar66 = uVar73;
              while (iVar55 = (int)uVar66, uVar66 = (ulong)(iVar55 - 1), iVar55 != 0) {
                fVar2 = *pfVar33;
                fVar3 = pfVar33[1];
                fVar120 = fVar209 + fVar2;
                fVar4 = pfVar33[2];
                fVar5 = pfVar33[3];
                fVar209 = pfVar33[4];
                fVar6 = pfVar33[5];
                in_ZMM4 = ZEXT3264(CONCAT428(fVar6,CONCAT424(fVar6,CONCAT420(fVar6,CONCAT416(fVar6,
                                                  CONCAT412(fVar6,CONCAT48(fVar6,CONCAT44(fVar6,
                                                  fVar6))))))));
                fVar202 = fVar209 * pfVar37[0x20] + fVar202 + fVar2 * *pfVar37;
                fVar203 = fVar209 * pfVar37[0x21] + fVar203 + fVar2 * pfVar37[1];
                fVar204 = fVar209 * pfVar37[0x22] + fVar204 + fVar2 * pfVar37[2];
                fVar205 = fVar209 * pfVar37[0x23] + fVar205 + fVar2 * pfVar37[3];
                fVar206 = fVar209 * pfVar37[0x24] + fVar206 + fVar2 * pfVar37[4];
                fVar207 = fVar209 * pfVar37[0x25] + fVar207 + fVar2 * pfVar37[5];
                fVar208 = fVar209 * pfVar37[0x26] + fVar208 + fVar2 * pfVar37[6];
                fVar209 = fVar209 + fVar120;
                fVar192 = fVar192 + fVar3 * pfVar37[8] + fVar6 * pfVar37[0x28];
                fVar195 = fVar195 + fVar3 * pfVar37[9] + fVar6 * pfVar37[0x29];
                fVar196 = fVar196 + fVar3 * pfVar37[10] + fVar6 * pfVar37[0x2a];
                fVar197 = fVar197 + fVar3 * pfVar37[0xb] + fVar6 * pfVar37[0x2b];
                fVar198 = fVar198 + fVar3 * pfVar37[0xc] + fVar6 * pfVar37[0x2c];
                fVar199 = fVar199 + fVar3 * pfVar37[0xd] + fVar6 * pfVar37[0x2d];
                fVar200 = fVar200 + fVar3 * pfVar37[0xe] + fVar6 * pfVar37[0x2e];
                fVar201 = fVar201 + fVar3 + fVar120;
                fVar2 = pfVar33[6];
                fVar3 = pfVar33[7];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar37[0x3e],
                                                             CONCAT420(fVar3 * pfVar37[0x3d],
                                                                       CONCAT416(fVar3 * pfVar37[
                                                  0x3c],CONCAT412(fVar3 * pfVar37[0x3b],
                                                                  CONCAT48(fVar3 * pfVar37[0x3a],
                                                                           CONCAT44(fVar3 * pfVar37[
                                                  0x39],fVar3 * pfVar37[0x38]))))))));
                fVar80 = fVar4 * pfVar37[0x10] + fVar80 + fVar2 * pfVar37[0x30];
                fVar95 = fVar4 * pfVar37[0x11] + fVar95 + fVar2 * pfVar37[0x31];
                fVar96 = fVar4 * pfVar37[0x12] + fVar96 + fVar2 * pfVar37[0x32];
                fVar97 = fVar4 * pfVar37[0x13] + fVar97 + fVar2 * pfVar37[0x33];
                fVar98 = fVar4 * pfVar37[0x14] + fVar98 + fVar2 * pfVar37[0x34];
                fVar99 = fVar4 * pfVar37[0x15] + fVar99 + fVar2 * pfVar37[0x35];
                fVar100 = fVar4 * pfVar37[0x16] + fVar100 + fVar2 * pfVar37[0x36];
                fVar101 = fVar4 + fVar101 + fVar2;
                fVar148 = fVar5 * pfVar37[0x18] + fVar148 + fVar3 * pfVar37[0x38];
                fVar152 = fVar5 * pfVar37[0x19] + fVar152 + fVar3 * pfVar37[0x39];
                fVar153 = fVar5 * pfVar37[0x1a] + fVar153 + fVar3 * pfVar37[0x3a];
                fVar154 = fVar5 * pfVar37[0x1b] + fVar154 + fVar3 * pfVar37[0x3b];
                fVar155 = fVar5 * pfVar37[0x1c] + fVar155 + fVar3 * pfVar37[0x3c];
                fVar156 = fVar5 * pfVar37[0x1d] + fVar156 + fVar3 * pfVar37[0x3d];
                fVar157 = fVar5 * pfVar37[0x1e] + fVar157 + fVar3 * pfVar37[0x3e];
                fVar158 = fVar5 + fVar158 + fVar3;
                pfVar37 = pfVar37 + 0x40;
                pfVar33 = pfVar33 + iVar26;
              }
              pfVar54 = pfVar54 + uVar73 * 0x40;
            }
            else {
              pfVar33 = (float *)((long)local_88.data + lVar32 + (long)iVar29 * 4);
            }
            if (local_88.elempack == 4) {
              pfVar38 = pfVar33 + 3;
              uVar66 = uVar73;
              pfVar37 = pfVar54;
              while (iVar55 = (int)uVar66, uVar66 = (ulong)(iVar55 - 1), iVar55 != 0) {
                fVar2 = pfVar38[-3];
                fVar3 = pfVar38[-2];
                fVar120 = fVar209 + fVar2;
                fVar4 = pfVar38[-1];
                fVar5 = *pfVar38;
                fVar148 = fVar5 * pfVar37[0x18] + fVar148;
                fVar152 = fVar5 * pfVar37[0x19] + fVar152;
                fVar153 = fVar5 * pfVar37[0x1a] + fVar153;
                fVar154 = fVar5 * pfVar37[0x1b] + fVar154;
                fVar155 = fVar5 * pfVar37[0x1c] + fVar155;
                fVar156 = fVar5 * pfVar37[0x1d] + fVar156;
                fVar157 = fVar5 * pfVar37[0x1e] + fVar157;
                in_ZMM4 = ZEXT3264(CONCAT428(fVar5 + fVar158,
                                             CONCAT424(fVar157,CONCAT420(fVar156,CONCAT416(fVar155,
                                                  CONCAT412(fVar154,CONCAT48(fVar153,CONCAT44(
                                                  fVar152,fVar148))))))));
                fVar209 = pfVar38[lVar48 + -3];
                fVar6 = pfVar38[lVar48 + -2];
                fVar202 = fVar202 + fVar2 * *pfVar37 + fVar209 * pfVar37[0x20];
                fVar203 = fVar203 + fVar2 * pfVar37[1] + fVar209 * pfVar37[0x21];
                fVar204 = fVar204 + fVar2 * pfVar37[2] + fVar209 * pfVar37[0x22];
                fVar205 = fVar205 + fVar2 * pfVar37[3] + fVar209 * pfVar37[0x23];
                fVar206 = fVar206 + fVar2 * pfVar37[4] + fVar209 * pfVar37[0x24];
                fVar207 = fVar207 + fVar2 * pfVar37[5] + fVar209 * pfVar37[0x25];
                fVar208 = fVar208 + fVar2 * pfVar37[6] + fVar209 * pfVar37[0x26];
                fVar209 = fVar120 + fVar209;
                fVar192 = fVar192 + fVar3 * pfVar37[8] + fVar6 * pfVar37[0x28];
                fVar195 = fVar195 + fVar3 * pfVar37[9] + fVar6 * pfVar37[0x29];
                fVar196 = fVar196 + fVar3 * pfVar37[10] + fVar6 * pfVar37[0x2a];
                fVar197 = fVar197 + fVar3 * pfVar37[0xb] + fVar6 * pfVar37[0x2b];
                fVar198 = fVar198 + fVar3 * pfVar37[0xc] + fVar6 * pfVar37[0x2c];
                fVar199 = fVar199 + fVar3 * pfVar37[0xd] + fVar6 * pfVar37[0x2d];
                fVar200 = fVar200 + fVar3 * pfVar37[0xe] + fVar6 * pfVar37[0x2e];
                fVar201 = fVar201 + fVar3 + fVar120;
                fVar2 = pfVar38[lVar48 + -1];
                fVar3 = pfVar38[lVar48];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar37[0x3e],
                                                             CONCAT420(fVar3 * pfVar37[0x3d],
                                                                       CONCAT416(fVar3 * pfVar37[
                                                  0x3c],CONCAT412(fVar3 * pfVar37[0x3b],
                                                                  CONCAT48(fVar3 * pfVar37[0x3a],
                                                                           CONCAT44(fVar3 * pfVar37[
                                                  0x39],fVar3 * pfVar37[0x38]))))))));
                fVar80 = fVar4 * pfVar37[0x10] + fVar80 + fVar2 * pfVar37[0x30];
                fVar95 = fVar4 * pfVar37[0x11] + fVar95 + fVar2 * pfVar37[0x31];
                fVar96 = fVar4 * pfVar37[0x12] + fVar96 + fVar2 * pfVar37[0x32];
                fVar97 = fVar4 * pfVar37[0x13] + fVar97 + fVar2 * pfVar37[0x33];
                fVar98 = fVar4 * pfVar37[0x14] + fVar98 + fVar2 * pfVar37[0x34];
                fVar99 = fVar4 * pfVar37[0x15] + fVar99 + fVar2 * pfVar37[0x35];
                fVar100 = fVar4 * pfVar37[0x16] + fVar100 + fVar2 * pfVar37[0x36];
                fVar101 = fVar4 + fVar101 + fVar2;
                fVar148 = fVar148 + fVar3 * pfVar37[0x38];
                fVar152 = fVar152 + fVar3 * pfVar37[0x39];
                fVar153 = fVar153 + fVar3 * pfVar37[0x3a];
                fVar154 = fVar154 + fVar3 * pfVar37[0x3b];
                fVar155 = fVar155 + fVar3 * pfVar37[0x3c];
                fVar156 = fVar156 + fVar3 * pfVar37[0x3d];
                fVar157 = fVar157 + fVar3 * pfVar37[0x3e];
                fVar158 = fVar5 + fVar158 + fVar3;
                pfVar37 = pfVar37 + 0x40;
                pfVar38 = pfVar38 + lVar42;
              }
              pfVar54 = pfVar54 + uVar73 * 0x40;
              pfVar33 = pfVar33 + lVar42 * uVar73;
            }
            uVar66 = uVar73;
            pfVar37 = pfVar54;
            if (local_88.elempack == 1) {
              while ((int)uVar66 != 0) {
                fVar2 = *pfVar33;
                fVar3 = pfVar33[lVar48];
                fVar120 = fVar209 + fVar2;
                fVar4 = pfVar33[iVar23];
                fVar5 = pfVar33[iVar8];
                fVar148 = fVar5 * pfVar37[0x18] + fVar148;
                fVar152 = fVar5 * pfVar37[0x19] + fVar152;
                fVar153 = fVar5 * pfVar37[0x1a] + fVar153;
                fVar154 = fVar5 * pfVar37[0x1b] + fVar154;
                fVar155 = fVar5 * pfVar37[0x1c] + fVar155;
                fVar156 = fVar5 * pfVar37[0x1d] + fVar156;
                fVar157 = fVar5 * pfVar37[0x1e] + fVar157;
                in_ZMM4 = ZEXT3264(CONCAT428(fVar5 + fVar158,
                                             CONCAT424(fVar157,CONCAT420(fVar156,CONCAT416(fVar155,
                                                  CONCAT412(fVar154,CONCAT48(fVar153,CONCAT44(
                                                  fVar152,fVar148))))))));
                fVar209 = pfVar33[iVar27];
                fVar6 = pfVar33[iVar18];
                fVar202 = fVar202 + fVar2 * *pfVar37 + fVar209 * pfVar37[0x20];
                fVar203 = fVar203 + fVar2 * pfVar37[1] + fVar209 * pfVar37[0x21];
                fVar204 = fVar204 + fVar2 * pfVar37[2] + fVar209 * pfVar37[0x22];
                fVar205 = fVar205 + fVar2 * pfVar37[3] + fVar209 * pfVar37[0x23];
                fVar206 = fVar206 + fVar2 * pfVar37[4] + fVar209 * pfVar37[0x24];
                fVar207 = fVar207 + fVar2 * pfVar37[5] + fVar209 * pfVar37[0x25];
                fVar208 = fVar208 + fVar2 * pfVar37[6] + fVar209 * pfVar37[0x26];
                fVar209 = fVar120 + fVar209;
                fVar192 = fVar192 + fVar3 * pfVar37[8] + fVar6 * pfVar37[0x28];
                fVar195 = fVar195 + fVar3 * pfVar37[9] + fVar6 * pfVar37[0x29];
                fVar196 = fVar196 + fVar3 * pfVar37[10] + fVar6 * pfVar37[0x2a];
                fVar197 = fVar197 + fVar3 * pfVar37[0xb] + fVar6 * pfVar37[0x2b];
                fVar198 = fVar198 + fVar3 * pfVar37[0xc] + fVar6 * pfVar37[0x2c];
                fVar199 = fVar199 + fVar3 * pfVar37[0xd] + fVar6 * pfVar37[0x2d];
                fVar200 = fVar200 + fVar3 * pfVar37[0xe] + fVar6 * pfVar37[0x2e];
                fVar201 = fVar201 + fVar3 + fVar120;
                fVar2 = pfVar33[iVar28];
                fVar3 = pfVar33[iVar39];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar37[0x3e],
                                                             CONCAT420(fVar3 * pfVar37[0x3d],
                                                                       CONCAT416(fVar3 * pfVar37[
                                                  0x3c],CONCAT412(fVar3 * pfVar37[0x3b],
                                                                  CONCAT48(fVar3 * pfVar37[0x3a],
                                                                           CONCAT44(fVar3 * pfVar37[
                                                  0x39],fVar3 * pfVar37[0x38]))))))));
                fVar80 = fVar4 * pfVar37[0x10] + fVar80 + fVar2 * pfVar37[0x30];
                fVar95 = fVar4 * pfVar37[0x11] + fVar95 + fVar2 * pfVar37[0x31];
                fVar96 = fVar4 * pfVar37[0x12] + fVar96 + fVar2 * pfVar37[0x32];
                fVar97 = fVar4 * pfVar37[0x13] + fVar97 + fVar2 * pfVar37[0x33];
                fVar98 = fVar4 * pfVar37[0x14] + fVar98 + fVar2 * pfVar37[0x34];
                fVar99 = fVar4 * pfVar37[0x15] + fVar99 + fVar2 * pfVar37[0x35];
                fVar100 = fVar4 * pfVar37[0x16] + fVar100 + fVar2 * pfVar37[0x36];
                fVar101 = fVar4 + fVar101 + fVar2;
                fVar148 = fVar148 + fVar3 * pfVar37[0x38];
                fVar152 = fVar152 + fVar3 * pfVar37[0x39];
                fVar153 = fVar153 + fVar3 * pfVar37[0x3a];
                fVar154 = fVar154 + fVar3 * pfVar37[0x3b];
                fVar155 = fVar155 + fVar3 * pfVar37[0x3c];
                fVar156 = fVar156 + fVar3 * pfVar37[0x3d];
                fVar157 = fVar157 + fVar3 * pfVar37[0x3e];
                fVar158 = fVar5 + fVar158 + fVar3;
                pfVar33 = pfVar33 + lVar49;
                uVar66 = (ulong)((int)uVar66 - 1);
                pfVar37 = pfVar37 + 0x40;
              }
              pfVar54 = pfVar54 + uVar73 * 0x40;
            }
            uVar59 = uVar59 + 8;
            lVar65 = lVar65 + lVar43 * 8;
            pfVar69 = pfVar69 + lVar43 * 2;
          }
          for (; (int)((uint)uVar59 | 3) < local_210; uVar59 = uVar59 + 4) {
            lVar32 = (int)((long)((ulong)(uint)((int)(uint)uVar59 >> 0x1f) << 0x20 |
                                 uVar59 & 0xffffffff) / (long)local_88.elempack) * lVar43;
            if (local_88.elempack == 4) {
              pfVar33 = (float *)((long)local_88.data + lVar32 + (long)iVar51 * 4);
              uVar66 = uVar73;
              pfVar37 = pfVar54;
              while (iVar55 = (int)uVar66, uVar66 = (ulong)(iVar55 - 1), iVar55 != 0) {
                fVar2 = *pfVar33;
                fVar3 = pfVar33[1];
                fVar202 = fVar202 + fVar2 * *pfVar37;
                fVar203 = fVar203 + fVar2 * pfVar37[1];
                fVar204 = fVar204 + fVar2 * pfVar37[2];
                fVar205 = fVar205 + fVar2 * pfVar37[3];
                fVar206 = fVar206 + fVar2 * pfVar37[4];
                fVar207 = fVar207 + fVar2 * pfVar37[5];
                fVar208 = fVar208 + fVar2 * pfVar37[6];
                fVar209 = fVar209 + fVar2;
                fVar192 = fVar192 + fVar3 * pfVar37[8];
                fVar195 = fVar195 + fVar3 * pfVar37[9];
                fVar196 = fVar196 + fVar3 * pfVar37[10];
                fVar197 = fVar197 + fVar3 * pfVar37[0xb];
                fVar198 = fVar198 + fVar3 * pfVar37[0xc];
                fVar199 = fVar199 + fVar3 * pfVar37[0xd];
                fVar200 = fVar200 + fVar3 * pfVar37[0xe];
                fVar201 = fVar201 + fVar2;
                fVar2 = pfVar33[2];
                fVar3 = pfVar33[3];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar37[0x1e],
                                                             CONCAT420(fVar3 * pfVar37[0x1d],
                                                                       CONCAT416(fVar3 * pfVar37[
                                                  0x1c],CONCAT412(fVar3 * pfVar37[0x1b],
                                                                  CONCAT48(fVar3 * pfVar37[0x1a],
                                                                           CONCAT44(fVar3 * pfVar37[
                                                  0x19],fVar3 * pfVar37[0x18]))))))));
                fVar80 = fVar2 * pfVar37[0x10] + fVar80;
                fVar95 = fVar2 * pfVar37[0x11] + fVar95;
                fVar96 = fVar2 * pfVar37[0x12] + fVar96;
                fVar97 = fVar2 * pfVar37[0x13] + fVar97;
                fVar98 = fVar2 * pfVar37[0x14] + fVar98;
                fVar99 = fVar2 * pfVar37[0x15] + fVar99;
                fVar100 = fVar2 * pfVar37[0x16] + fVar100;
                fVar101 = fVar2 + fVar101;
                fVar148 = fVar3 * pfVar37[0x18] + fVar148;
                fVar152 = fVar3 * pfVar37[0x19] + fVar152;
                fVar153 = fVar3 * pfVar37[0x1a] + fVar153;
                fVar154 = fVar3 * pfVar37[0x1b] + fVar154;
                fVar155 = fVar3 * pfVar37[0x1c] + fVar155;
                fVar156 = fVar3 * pfVar37[0x1d] + fVar156;
                fVar157 = fVar3 * pfVar37[0x1e] + fVar157;
                fVar158 = fVar3 + fVar158;
                pfVar37 = pfVar37 + 0x20;
                pfVar33 = pfVar33 + lVar42;
              }
              pfVar54 = pfVar54 + uVar73 * 0x20;
            }
            else {
              pfVar33 = (float *)((long)local_88.data + lVar32 + (long)iVar29 * 4);
            }
            uVar66 = uVar73;
            pfVar37 = pfVar54;
            if (local_88.elempack == 1) {
              while ((int)uVar66 != 0) {
                fVar2 = *pfVar33;
                fVar3 = pfVar33[lVar48];
                fVar202 = fVar202 + fVar2 * *pfVar37;
                fVar203 = fVar203 + fVar2 * pfVar37[1];
                fVar204 = fVar204 + fVar2 * pfVar37[2];
                fVar205 = fVar205 + fVar2 * pfVar37[3];
                fVar206 = fVar206 + fVar2 * pfVar37[4];
                fVar207 = fVar207 + fVar2 * pfVar37[5];
                fVar208 = fVar208 + fVar2 * pfVar37[6];
                fVar209 = fVar209 + fVar2;
                fVar192 = fVar192 + fVar3 * pfVar37[8];
                fVar195 = fVar195 + fVar3 * pfVar37[9];
                fVar196 = fVar196 + fVar3 * pfVar37[10];
                fVar197 = fVar197 + fVar3 * pfVar37[0xb];
                fVar198 = fVar198 + fVar3 * pfVar37[0xc];
                fVar199 = fVar199 + fVar3 * pfVar37[0xd];
                fVar200 = fVar200 + fVar3 * pfVar37[0xe];
                fVar201 = fVar201 + fVar2;
                fVar2 = pfVar33[iVar23];
                fVar3 = pfVar33[iVar8];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar37[0x1e],
                                                             CONCAT420(fVar3 * pfVar37[0x1d],
                                                                       CONCAT416(fVar3 * pfVar37[
                                                  0x1c],CONCAT412(fVar3 * pfVar37[0x1b],
                                                                  CONCAT48(fVar3 * pfVar37[0x1a],
                                                                           CONCAT44(fVar3 * pfVar37[
                                                  0x19],fVar3 * pfVar37[0x18]))))))));
                fVar80 = fVar2 * pfVar37[0x10] + fVar80;
                fVar95 = fVar2 * pfVar37[0x11] + fVar95;
                fVar96 = fVar2 * pfVar37[0x12] + fVar96;
                fVar97 = fVar2 * pfVar37[0x13] + fVar97;
                fVar98 = fVar2 * pfVar37[0x14] + fVar98;
                fVar99 = fVar2 * pfVar37[0x15] + fVar99;
                fVar100 = fVar2 * pfVar37[0x16] + fVar100;
                fVar101 = fVar2 + fVar101;
                fVar148 = fVar3 * pfVar37[0x18] + fVar148;
                fVar152 = fVar3 * pfVar37[0x19] + fVar152;
                fVar153 = fVar3 * pfVar37[0x1a] + fVar153;
                fVar154 = fVar3 * pfVar37[0x1b] + fVar154;
                fVar155 = fVar3 * pfVar37[0x1c] + fVar155;
                fVar156 = fVar3 * pfVar37[0x1d] + fVar156;
                fVar157 = fVar3 * pfVar37[0x1e] + fVar157;
                fVar158 = fVar3 + fVar158;
                pfVar33 = pfVar33 + lVar49;
                uVar66 = (ulong)((int)uVar66 - 1);
                pfVar37 = pfVar37 + 0x20;
              }
              pfVar54 = pfVar54 + uVar73 * 0x20;
            }
            lVar65 = lVar65 + lVar43 * 4;
            pfVar69 = pfVar69 + lVar43;
          }
          for (; (long)(uVar59 | 1) < lVar58; uVar59 = uVar59 + 2) {
            lVar32 = 0;
            uVar66 = uVar73;
            pfVar33 = pfVar54;
            while (iVar29 = (int)uVar66, uVar66 = (ulong)(iVar29 - 1), iVar29 != 0) {
              fVar2 = *(float *)((long)pfVar69 + lVar32);
              fVar3 = *(float *)(lVar65 + lVar32);
              in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar33[0xe],
                                                           CONCAT420(fVar3 * pfVar33[0xd],
                                                                     CONCAT416(fVar3 * pfVar33[0xc],
                                                                               CONCAT412(fVar3 * 
                                                  pfVar33[0xb],
                                                  CONCAT48(fVar3 * pfVar33[10],
                                                           CONCAT44(fVar3 * pfVar33[9],
                                                                    fVar3 * pfVar33[8]))))))));
              fVar202 = fVar202 + fVar2 * *pfVar33;
              fVar203 = fVar203 + fVar2 * pfVar33[1];
              fVar204 = fVar204 + fVar2 * pfVar33[2];
              fVar205 = fVar205 + fVar2 * pfVar33[3];
              fVar206 = fVar206 + fVar2 * pfVar33[4];
              fVar207 = fVar207 + fVar2 * pfVar33[5];
              fVar208 = fVar208 + fVar2 * pfVar33[6];
              fVar209 = fVar209 + fVar2;
              fVar192 = fVar192 + fVar3 * pfVar33[8];
              fVar195 = fVar195 + fVar3 * pfVar33[9];
              fVar196 = fVar196 + fVar3 * pfVar33[10];
              fVar197 = fVar197 + fVar3 * pfVar33[0xb];
              fVar198 = fVar198 + fVar3 * pfVar33[0xc];
              fVar199 = fVar199 + fVar3 * pfVar33[0xd];
              fVar200 = fVar200 + fVar3 * pfVar33[0xe];
              fVar201 = fVar201 + fVar3;
              pfVar33 = pfVar33 + 0x10;
              lVar32 = lVar32 + lVar50;
            }
            pfVar54 = pfVar54 + uVar73 * 0x10;
            lVar65 = lVar65 + lVar43 * 2;
            pfVar69 = (float *)((long)pfVar69 + lVar43 * 2);
          }
          for (; uVar66 = uVar73, pfVar33 = pfVar69, pfVar37 = pfVar54, (long)uVar59 < lVar58;
              uVar59 = uVar59 + 1) {
            while ((int)uVar66 != 0) {
              fVar2 = *pfVar33;
              fVar202 = fVar202 + fVar2 * *pfVar37;
              fVar203 = fVar203 + fVar2 * pfVar37[1];
              fVar204 = fVar204 + fVar2 * pfVar37[2];
              fVar205 = fVar205 + fVar2 * pfVar37[3];
              fVar206 = fVar206 + fVar2 * pfVar37[4];
              fVar207 = fVar207 + fVar2 * pfVar37[5];
              fVar208 = fVar208 + fVar2 * pfVar37[6];
              fVar209 = fVar209 + fVar2;
              uVar66 = (ulong)((int)uVar66 - 1);
              pfVar33 = pfVar33 + lVar49;
              pfVar37 = pfVar37 + 8;
            }
            pfVar54 = pfVar54 + uVar73 * 8;
            pfVar69 = (float *)((long)pfVar69 + lVar43);
          }
          fVar202 = fVar80 + fVar148 + fVar192 + fVar202;
          fVar203 = fVar95 + fVar152 + fVar195 + fVar203;
          auVar92._0_8_ = CONCAT44(fVar203,fVar202);
          auVar92._8_4_ = fVar96 + fVar153 + fVar196 + fVar204;
          auVar92._12_4_ = fVar97 + fVar154 + fVar197 + fVar205;
          auVar92._16_4_ = fVar98 + fVar155 + fVar198 + fVar206;
          auVar92._20_4_ = fVar99 + fVar156 + fVar199 + fVar207;
          auVar92._24_4_ = fVar100 + fVar157 + fVar200 + fVar208;
          auVar92._28_4_ = fVar101 + fVar158 + fVar201 + fVar209;
          auVar151 = auVar92;
          if (5 < iVar10 - 1U) goto switchD_004a0fd9_caseD_1;
          auVar78 = auVar79._0_32_;
          auVar151 = vmaxps_avx(auVar92,auVar78);
          fVar209 = auVar186._0_4_;
          fVar153 = auVar186._4_4_;
          fVar154 = auVar186._8_4_;
          fVar204 = auVar186._12_4_;
          fVar205 = auVar186._16_4_;
          fVar206 = auVar186._20_4_;
          fVar207 = auVar186._24_4_;
          fVar208 = auVar186._28_4_;
          switch(iVar10) {
          case 2:
            auVar92 = vminps_avx(auVar92,auVar78);
            fVar209 = **(float **)(&this->field_0xf8 + (long)p_Var12);
            auVar149._0_4_ = fVar209 * auVar92._0_4_ + auVar151._0_4_;
            auVar149._4_4_ = fVar209 * auVar92._4_4_ + auVar151._4_4_;
            auVar149._8_4_ = fVar209 * auVar92._8_4_ + auVar151._8_4_;
            auVar149._12_4_ = fVar209 * auVar92._12_4_ + auVar151._12_4_;
            auVar149._16_4_ = fVar209 * auVar92._16_4_ + auVar151._16_4_;
            auVar149._20_4_ = fVar209 * auVar92._20_4_ + auVar151._20_4_;
            auVar149._24_4_ = fVar209 * auVar92._24_4_ + auVar151._24_4_;
            auVar149._28_4_ = auVar92._28_4_ + auVar151._28_4_;
            auVar151 = auVar149;
            break;
          case 3:
            uVar11 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var12);
            auVar114._4_4_ = uVar11;
            auVar114._0_4_ = uVar11;
            auVar114._8_4_ = uVar11;
            auVar114._12_4_ = uVar11;
            auVar114._16_4_ = uVar11;
            auVar114._20_4_ = uVar11;
            auVar114._24_4_ = uVar11;
            auVar114._28_4_ = uVar11;
            uVar11 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var12))[1];
            auVar136._4_4_ = uVar11;
            auVar136._0_4_ = uVar11;
            auVar136._8_4_ = uVar11;
            auVar136._12_4_ = uVar11;
            auVar136._16_4_ = uVar11;
            auVar136._20_4_ = uVar11;
            auVar136._24_4_ = uVar11;
            auVar136._28_4_ = uVar11;
            in_ZMM3 = ZEXT3264(auVar136);
            auVar151 = vmaxps_avx(auVar92,auVar114);
            auVar151 = vminps_avx(auVar151,auVar136);
            break;
          case 4:
            auVar93._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar93._8_4_ = -auVar92._8_4_;
            auVar93._12_4_ = -auVar92._12_4_;
            auVar93._16_4_ = -auVar92._16_4_;
            auVar93._20_4_ = -auVar92._20_4_;
            auVar93._24_4_ = -auVar92._24_4_;
            auVar93._28_4_ = -auVar92._28_4_;
            auVar115._8_4_ = 0x42b0c0a5;
            auVar115._0_8_ = 0x42b0c0a542b0c0a5;
            auVar115._12_4_ = 0x42b0c0a5;
            auVar115._16_4_ = 0x42b0c0a5;
            auVar115._20_4_ = 0x42b0c0a5;
            auVar115._24_4_ = 0x42b0c0a5;
            auVar115._28_4_ = 0x42b0c0a5;
            auVar151 = vminps_avx(auVar93,auVar115);
            auVar116._8_4_ = 0xc2b0c0a5;
            auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar116._12_4_ = 0xc2b0c0a5;
            auVar116._16_4_ = 0xc2b0c0a5;
            auVar116._20_4_ = 0xc2b0c0a5;
            auVar116._24_4_ = 0xc2b0c0a5;
            auVar116._28_4_ = 0xc2b0c0a5;
            auVar92 = vmaxps_avx(auVar151,auVar116);
            auVar117._0_4_ = fVar209 + auVar92._0_4_ * 1.442695;
            auVar117._4_4_ = fVar153 + auVar92._4_4_ * 1.442695;
            auVar117._8_4_ = fVar154 + auVar92._8_4_ * 1.442695;
            auVar117._12_4_ = fVar204 + auVar92._12_4_ * 1.442695;
            auVar117._16_4_ = fVar205 + auVar92._16_4_ * 1.442695;
            auVar117._20_4_ = fVar206 + auVar92._20_4_ * 1.442695;
            auVar117._24_4_ = fVar207 + auVar92._24_4_ * 1.442695;
            auVar117._28_4_ = fVar208 + 1.442695;
            auVar78 = vroundps_avx(auVar117,1);
            auVar151 = vcmpps_avx(auVar117,auVar78,1);
            auVar151 = vandps_avx(auVar151,auVar147);
            auVar151 = vsubps_avx(auVar78,auVar151);
            fVar202 = auVar92._0_4_ + auVar151._0_4_ * -0.6931472;
            fVar203 = auVar92._4_4_ + auVar151._4_4_ * -0.6931472;
            fVar208 = auVar92._8_4_ + auVar151._8_4_ * -0.6931472;
            fVar148 = auVar92._12_4_ + auVar151._12_4_ * -0.6931472;
            fVar152 = auVar92._16_4_ + auVar151._16_4_ * -0.6931472;
            fVar155 = auVar92._20_4_ + auVar151._20_4_ * -0.6931472;
            fVar156 = auVar92._24_4_ + auVar151._24_4_ * -0.6931472;
            auVar102._0_4_ = (int)auVar151._0_4_;
            auVar102._4_4_ = (int)auVar151._4_4_;
            auVar102._8_4_ = (int)auVar151._8_4_;
            auVar102._12_4_ = (int)auVar151._12_4_;
            auVar118._16_4_ = (int)auVar151._16_4_;
            auVar118._0_16_ = auVar102;
            auVar118._20_4_ = (int)auVar151._20_4_;
            auVar118._24_4_ = (int)auVar151._24_4_;
            auVar118._28_4_ = (int)auVar151._28_4_;
            auVar137 = vpslld_avx(auVar102,0x17);
            auVar121 = vpslld_avx(auVar118._16_16_,0x17);
            auVar139._8_4_ = 0x3f800000;
            auVar139._0_8_ = 0x3f8000003f800000;
            auVar139._12_4_ = 0x3f800000;
            in_ZMM4 = ZEXT1664(auVar139);
            auVar121 = vpaddd_avx(auVar121,auVar139);
            auVar137 = vpaddd_avx(auVar137,auVar139);
            in_ZMM3 = ZEXT1664(auVar137);
            auVar94._0_4_ =
                 (fVar202 + 1.0 +
                 fVar202 * fVar202 *
                 (fVar209 +
                 ((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                  0.041665796) * fVar202 + 0.16666666) * fVar202)) * auVar137._0_4_ + 1.0;
            auVar94._4_4_ =
                 (fVar203 + 1.0 +
                 fVar203 * fVar203 *
                 (fVar153 +
                 ((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                  0.041665796) * fVar203 + 0.16666666) * fVar203)) * auVar137._4_4_ + 1.0;
            auVar94._8_4_ =
                 (fVar208 + 1.0 +
                 fVar208 * fVar208 *
                 (fVar154 +
                 ((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                  0.041665796) * fVar208 + 0.16666666) * fVar208)) * auVar137._8_4_ + 1.0;
            auVar94._12_4_ =
                 (fVar148 + 1.0 +
                 fVar148 * fVar148 *
                 (fVar204 +
                 ((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                  0.041665796) * fVar148 + 0.16666666) * fVar148)) * auVar137._12_4_ + 1.0;
            auVar94._16_4_ =
                 (fVar152 + 1.0 +
                 fVar152 * fVar152 *
                 (fVar205 +
                 ((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                  0.041665796) * fVar152 + 0.16666666) * fVar152)) * auVar121._0_4_ + 1.0;
            auVar94._20_4_ =
                 (fVar155 + 1.0 +
                 fVar155 * fVar155 *
                 (fVar206 +
                 ((((fVar155 * 0.00019875691 + 0.0013981999) * fVar155 + 0.008333452) * fVar155 +
                  0.041665796) * fVar155 + 0.16666666) * fVar155)) * auVar121._4_4_ + 1.0;
            auVar94._24_4_ =
                 (fVar156 + 1.0 +
                 fVar156 * fVar156 *
                 (fVar207 +
                 ((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) * fVar156 +
                  0.041665796) * fVar156 + 0.16666666) * fVar156)) * auVar121._8_4_ + 1.0;
            auVar94._28_4_ = auVar92._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
            auVar92 = vrcpps_avx(auVar94);
            fVar209 = auVar92._0_4_;
            fVar153 = auVar92._4_4_;
            auVar22._4_4_ = auVar94._4_4_ * fVar153;
            auVar22._0_4_ = auVar94._0_4_ * fVar209;
            fVar154 = auVar92._8_4_;
            auVar22._8_4_ = auVar94._8_4_ * fVar154;
            fVar202 = auVar92._12_4_;
            auVar22._12_4_ = auVar94._12_4_ * fVar202;
            fVar203 = auVar92._16_4_;
            auVar22._16_4_ = auVar94._16_4_ * fVar203;
            fVar204 = auVar92._20_4_;
            auVar22._20_4_ = auVar94._20_4_ * fVar204;
            fVar205 = auVar92._24_4_;
            auVar22._24_4_ = auVar94._24_4_ * fVar205;
            auVar22._28_4_ = auVar94._28_4_;
            auVar78 = vsubps_avx(auVar147,auVar22);
            auVar151._0_4_ = fVar209 + fVar209 * auVar78._0_4_;
            auVar151._4_4_ = fVar153 + fVar153 * auVar78._4_4_;
            auVar151._8_4_ = fVar154 + fVar154 * auVar78._8_4_;
            auVar151._12_4_ = fVar202 + fVar202 * auVar78._12_4_;
            auVar151._16_4_ = fVar203 + fVar203 * auVar78._16_4_;
            auVar151._20_4_ = fVar204 + fVar204 * auVar78._20_4_;
            auVar151._24_4_ = fVar205 + fVar205 * auVar78._24_4_;
            auVar151._28_4_ = auVar92._28_4_ + auVar78._28_4_;
            break;
          case 5:
            auVar159._8_4_ = 0x42b0c0a5;
            auVar159._0_8_ = 0x42b0c0a542b0c0a5;
            auVar159._12_4_ = 0x42b0c0a5;
            auVar159._16_4_ = 0x42b0c0a5;
            auVar159._20_4_ = 0x42b0c0a5;
            auVar159._24_4_ = 0x42b0c0a5;
            auVar159._28_4_ = 0x42b0c0a5;
            auVar151 = vminps_avx(auVar159,auVar92);
            auVar170._8_4_ = 0xc2b0c0a5;
            auVar170._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar170._12_4_ = 0xc2b0c0a5;
            auVar170._16_4_ = 0xc2b0c0a5;
            auVar170._20_4_ = 0xc2b0c0a5;
            auVar170._24_4_ = 0xc2b0c0a5;
            auVar170._28_4_ = 0xc2b0c0a5;
            auVar78 = vmaxps_avx(auVar170,auVar151);
            auVar128._0_4_ = fVar209 + auVar78._0_4_ * 1.442695;
            auVar128._4_4_ = fVar153 + auVar78._4_4_ * 1.442695;
            auVar128._8_4_ = fVar154 + auVar78._8_4_ * 1.442695;
            auVar128._12_4_ = fVar204 + auVar78._12_4_ * 1.442695;
            auVar128._16_4_ = fVar205 + auVar78._16_4_ * 1.442695;
            auVar128._20_4_ = fVar206 + auVar78._20_4_ * 1.442695;
            auVar128._24_4_ = fVar207 + auVar78._24_4_ * 1.442695;
            auVar128._28_4_ = fVar208 + in_ZMM3._28_4_;
            auVar119 = vroundps_avx(auVar128,1);
            auVar151 = vcmpps_avx(auVar128,auVar119,1);
            auVar151 = vandps_avx(auVar151,auVar147);
            auVar151 = vsubps_avx(auVar119,auVar151);
            auVar19._4_4_ = auVar151._4_4_ * 0.6931472;
            auVar19._0_4_ = auVar151._0_4_ * 0.6931472;
            auVar19._8_4_ = auVar151._8_4_ * 0.6931472;
            auVar19._12_4_ = auVar151._12_4_ * 0.6931472;
            auVar19._16_4_ = auVar151._16_4_ * 0.6931472;
            auVar19._20_4_ = auVar151._20_4_ * 0.6931472;
            auVar19._24_4_ = auVar151._24_4_ * 0.6931472;
            auVar19._28_4_ = auVar119._28_4_;
            auVar78 = vsubps_avx(auVar78,auVar19);
            fVar148 = auVar78._0_4_;
            fVar152 = auVar78._4_4_;
            fVar155 = auVar78._8_4_;
            fVar156 = auVar78._12_4_;
            fVar157 = auVar78._16_4_;
            fVar158 = auVar78._20_4_;
            fVar96 = auVar78._24_4_;
            auVar121._0_4_ = (int)auVar151._0_4_;
            auVar121._4_4_ = (int)auVar151._4_4_;
            auVar121._8_4_ = (int)auVar151._8_4_;
            auVar121._12_4_ = (int)auVar151._12_4_;
            auVar129._16_4_ = (int)auVar151._16_4_;
            auVar129._0_16_ = auVar121;
            auVar129._20_4_ = (int)auVar151._20_4_;
            auVar129._24_4_ = (int)auVar151._24_4_;
            auVar129._28_4_ = (int)auVar151._28_4_;
            auVar137 = vpslld_avx(auVar121,0x17);
            auVar121 = vpslld_avx(auVar129._16_16_,0x17);
            auVar121 = vpaddd_avx(auVar173,auVar121);
            auVar137 = vpaddd_avx(auVar173,auVar137);
            auVar150._0_4_ =
                 (fVar148 + 1.0 +
                 fVar148 * fVar148 *
                 (((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                   0.041665796) * fVar148 + 0.16666666) * fVar148 + fVar209)) * auVar137._0_4_ + 1.0
            ;
            auVar150._4_4_ =
                 (fVar152 + 1.0 +
                 fVar152 * fVar152 *
                 (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                   0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar153)) * auVar137._4_4_ + 1.0
            ;
            auVar150._8_4_ =
                 (fVar155 + 1.0 +
                 fVar155 * fVar155 *
                 (((((fVar155 * 0.00019875691 + 0.0013981999) * fVar155 + 0.008333452) * fVar155 +
                   0.041665796) * fVar155 + 0.16666666) * fVar155 + fVar154)) * auVar137._8_4_ + 1.0
            ;
            auVar150._12_4_ =
                 (fVar156 + 1.0 +
                 fVar156 * fVar156 *
                 (((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) * fVar156 +
                   0.041665796) * fVar156 + 0.16666666) * fVar156 + fVar204)) * auVar137._12_4_ +
                 1.0;
            auVar150._16_4_ =
                 (fVar157 + 1.0 +
                 fVar157 * fVar157 *
                 (((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) * fVar157 +
                   0.041665796) * fVar157 + 0.16666666) * fVar157 + fVar205)) * auVar121._0_4_ + 1.0
            ;
            auVar150._20_4_ =
                 (fVar158 + 1.0 +
                 fVar158 * fVar158 *
                 (((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                   0.041665796) * fVar158 + 0.16666666) * fVar158 + fVar206)) * auVar121._4_4_ + 1.0
            ;
            auVar150._24_4_ =
                 (fVar96 + 1.0 +
                 fVar96 * fVar96 *
                 (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
                   0.041665796) * fVar96 + 0.16666666) * fVar96 + fVar207)) * auVar121._8_4_ + 1.0;
            auVar150._28_4_ = auVar78._28_4_ + 1.0 + auVar119._28_4_ + 1.0;
            auVar111._8_4_ = 0x800000;
            auVar111._0_8_ = 0x80000000800000;
            auVar111._12_4_ = 0x800000;
            auVar111._16_4_ = 0x800000;
            auVar111._20_4_ = 0x800000;
            auVar111._24_4_ = 0x800000;
            auVar111._28_4_ = 0x800000;
            auVar119 = vmaxps_avx(auVar150,auVar111);
            auVar121 = vpsrld_avx(auVar119._16_16_,0x17);
            auVar145._8_4_ = 0x807fffff;
            auVar145._0_8_ = 0x807fffff807fffff;
            auVar145._12_4_ = 0x807fffff;
            auVar145._16_4_ = 0x807fffff;
            auVar145._20_4_ = 0x807fffff;
            auVar145._24_4_ = 0x807fffff;
            auVar145._28_4_ = 0x807fffff;
            auVar151 = vandps_avx(auVar119,auVar145);
            auVar135 = vorps_avx(auVar151,auVar186._0_32_);
            auVar194._8_4_ = 0x3f3504f3;
            auVar194._0_8_ = 0x3f3504f33f3504f3;
            auVar194._12_4_ = 0x3f3504f3;
            auVar194._16_4_ = 0x3f3504f3;
            auVar194._20_4_ = 0x3f3504f3;
            auVar194._24_4_ = 0x3f3504f3;
            auVar194._28_4_ = 0x3f3504f3;
            auVar78 = vcmpps_avx(auVar194,auVar135,2);
            auVar151 = vandnps_avx(auVar78,auVar135);
            fVar148 = auVar151._0_4_ + auVar135._0_4_ + -1.0;
            fVar152 = auVar151._4_4_ + auVar135._4_4_ + -1.0;
            fVar155 = auVar151._8_4_ + auVar135._8_4_ + -1.0;
            fVar156 = auVar151._12_4_ + auVar135._12_4_ + -1.0;
            fVar157 = auVar151._16_4_ + auVar135._16_4_ + -1.0;
            fVar158 = auVar151._20_4_ + auVar135._20_4_ + -1.0;
            fVar96 = auVar151._24_4_ + auVar135._24_4_ + -1.0;
            auVar121 = vpsubd_avx(auVar121,auVar78._16_16_);
            auVar137 = vpsrld_avx(auVar119._0_16_,0x17);
            auVar138._8_4_ = 0xffffff81;
            auVar138._0_8_ = 0xffffff81ffffff81;
            auVar138._12_4_ = 0xffffff81;
            auVar121 = vpaddd_avx(auVar121,auVar138);
            auVar137 = vpsubd_avx(auVar137,auVar78._0_16_);
            auVar137 = vpaddd_avx(auVar137,auVar138);
            auVar112._16_16_ = auVar121;
            auVar112._0_16_ = auVar137;
            auVar78 = vcmpps_avx(auVar150,_DAT_004ef8c0,2);
            auVar119 = vcvtdq2ps_avx(auVar112);
            auVar20._4_4_ =
                 (fVar152 + auVar119._4_4_ * 0.6931472 +
                 fVar152 * fVar152 *
                 (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (
                                                  fVar152 * (fVar152 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._0_4_ =
                 (fVar148 + auVar119._0_4_ * 0.6931472 +
                 fVar148 * fVar148 *
                 (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * (fVar148 * (
                                                  fVar148 * (fVar148 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._8_4_ =
                 (fVar155 + auVar119._8_4_ * 0.6931472 +
                 fVar155 * fVar155 *
                 (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * (fVar155 * (
                                                  fVar155 * (fVar155 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._12_4_ =
                 (fVar156 + auVar119._12_4_ * 0.6931472 +
                 fVar156 * fVar156 *
                 (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * (fVar156 * (
                                                  fVar156 * (fVar156 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._16_4_ =
                 (fVar157 + auVar119._16_4_ * 0.6931472 +
                 fVar157 * fVar157 *
                 (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * (fVar157 * (
                                                  fVar157 * (fVar157 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._20_4_ =
                 (fVar158 + auVar119._20_4_ * 0.6931472 +
                 fVar158 * fVar158 *
                 (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (fVar158 * (
                                                  fVar158 * (fVar158 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._24_4_ =
                 (fVar96 + auVar119._24_4_ * 0.6931472 +
                 fVar96 * fVar96 *
                 (fVar96 * (fVar96 * (fVar96 * (fVar96 * (fVar96 * (fVar96 * (fVar96 * (fVar96 * (
                                                  fVar96 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                               0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                 -2.0;
            auVar20._28_4_ = auVar151._28_4_ + auVar135._28_4_ + -1.0 + auVar119._28_4_ + 0.0;
            auVar130._8_4_ = 0x7fffffff;
            auVar130._0_8_ = 0x7fffffff7fffffff;
            auVar130._12_4_ = 0x7fffffff;
            auVar130._16_4_ = 0x7fffffff;
            auVar130._20_4_ = 0x7fffffff;
            auVar130._24_4_ = 0x7fffffff;
            auVar130._28_4_ = 0x7fffffff;
            auVar151 = vblendvps_avx(auVar20,auVar130,auVar78);
            auVar131._8_4_ = 0x42b0c0a5;
            auVar131._0_8_ = 0x42b0c0a542b0c0a5;
            auVar131._12_4_ = 0x42b0c0a5;
            auVar131._16_4_ = 0x42b0c0a5;
            auVar131._20_4_ = 0x42b0c0a5;
            auVar131._24_4_ = 0x42b0c0a5;
            auVar131._28_4_ = 0x42b0c0a5;
            auVar151 = vminps_avx(auVar151,auVar131);
            auVar132._8_4_ = 0xc2b0c0a5;
            auVar132._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar132._12_4_ = 0xc2b0c0a5;
            auVar132._16_4_ = 0xc2b0c0a5;
            auVar132._20_4_ = 0xc2b0c0a5;
            auVar132._24_4_ = 0xc2b0c0a5;
            auVar132._28_4_ = 0xc2b0c0a5;
            auVar78 = vmaxps_avx(auVar151,auVar132);
            auVar133._0_4_ = auVar78._0_4_ * 1.442695 + fVar209;
            auVar133._4_4_ = auVar78._4_4_ * 1.442695 + fVar153;
            auVar133._8_4_ = auVar78._8_4_ * 1.442695 + fVar154;
            auVar133._12_4_ = auVar78._12_4_ * 1.442695 + fVar204;
            auVar133._16_4_ = auVar78._16_4_ * 1.442695 + fVar205;
            auVar133._20_4_ = auVar78._20_4_ * 1.442695 + fVar206;
            auVar133._24_4_ = auVar78._24_4_ * 1.442695 + fVar207;
            auVar133._28_4_ = fVar208 + 1.442695;
            auVar119 = vroundps_avx(auVar133,1);
            auVar151 = vcmpps_avx(auVar133,auVar119,1);
            auVar151 = vandps_avx(auVar151,auVar147);
            auVar151 = vsubps_avx(auVar119,auVar151);
            auVar21._4_4_ = auVar151._4_4_ * 0.6931472;
            auVar21._0_4_ = auVar151._0_4_ * 0.6931472;
            auVar21._8_4_ = auVar151._8_4_ * 0.6931472;
            auVar21._12_4_ = auVar151._12_4_ * 0.6931472;
            auVar21._16_4_ = auVar151._16_4_ * 0.6931472;
            auVar21._20_4_ = auVar151._20_4_ * 0.6931472;
            auVar21._24_4_ = auVar151._24_4_ * 0.6931472;
            auVar21._28_4_ = auVar119._28_4_;
            auVar78 = vsubps_avx(auVar78,auVar21);
            fVar208 = auVar78._0_4_;
            fVar148 = auVar78._4_4_;
            fVar152 = auVar78._8_4_;
            fVar155 = auVar78._12_4_;
            fVar156 = auVar78._16_4_;
            fVar157 = auVar78._20_4_;
            fVar158 = auVar78._24_4_;
            auVar186 = ZEXT3264(auVar186._0_32_);
            auVar79 = ZEXT864(0) << 0x20;
            auVar137._0_4_ = (int)auVar151._0_4_;
            auVar137._4_4_ = (int)auVar151._4_4_;
            auVar137._8_4_ = (int)auVar151._8_4_;
            auVar137._12_4_ = (int)auVar151._12_4_;
            auVar134._16_4_ = (int)auVar151._16_4_;
            auVar134._0_16_ = auVar137;
            auVar134._20_4_ = (int)auVar151._20_4_;
            auVar134._24_4_ = (int)auVar151._24_4_;
            auVar134._28_4_ = (int)auVar151._28_4_;
            auVar137 = vpslld_avx(auVar137,0x17);
            auVar121 = vpslld_avx(auVar134._16_16_,0x17);
            auVar121 = vpaddd_avx(auVar173,auVar121);
            auVar137 = vpaddd_avx(auVar173,auVar137);
            auVar113._0_4_ =
                 (fVar208 + 1.0 +
                 fVar208 * fVar208 *
                 (fVar209 +
                 ((((fVar208 * 0.00019875691 + 0.0013981999) * fVar208 + 0.008333452) * fVar208 +
                  0.041665796) * fVar208 + 0.16666666) * fVar208)) * auVar137._0_4_ + 1.0;
            auVar113._4_4_ =
                 (fVar148 + 1.0 +
                 fVar148 * fVar148 *
                 (fVar153 +
                 ((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                  0.041665796) * fVar148 + 0.16666666) * fVar148)) * auVar137._4_4_ + 1.0;
            auVar113._8_4_ =
                 (fVar152 + 1.0 +
                 fVar152 * fVar152 *
                 (fVar154 +
                 ((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                  0.041665796) * fVar152 + 0.16666666) * fVar152)) * auVar137._8_4_ + 1.0;
            auVar113._12_4_ =
                 (fVar155 + 1.0 +
                 fVar155 * fVar155 *
                 (fVar204 +
                 ((((fVar155 * 0.00019875691 + 0.0013981999) * fVar155 + 0.008333452) * fVar155 +
                  0.041665796) * fVar155 + 0.16666666) * fVar155)) * auVar137._12_4_ + 1.0;
            auVar113._16_4_ =
                 (fVar156 + 1.0 +
                 fVar156 * fVar156 *
                 (fVar205 +
                 ((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) * fVar156 +
                  0.041665796) * fVar156 + 0.16666666) * fVar156)) * auVar121._0_4_ + 1.0;
            auVar113._20_4_ =
                 (fVar157 + 1.0 +
                 fVar157 * fVar157 *
                 (fVar206 +
                 ((((fVar157 * 0.00019875691 + 0.0013981999) * fVar157 + 0.008333452) * fVar157 +
                  0.041665796) * fVar157 + 0.16666666) * fVar157)) * auVar121._4_4_ + 1.0;
            auVar113._24_4_ =
                 (fVar158 + 1.0 +
                 fVar158 * fVar158 *
                 (fVar207 +
                 ((((fVar158 * 0.00019875691 + 0.0013981999) * fVar158 + 0.008333452) * fVar158 +
                  0.041665796) * fVar158 + 0.16666666) * fVar158)) * auVar121._8_4_ + 1.0;
            auVar113._28_4_ = auVar78._28_4_ + 1.0 + auVar119._28_4_ + 1.0;
            auVar151 = vrcpps_avx(auVar113);
            fVar209 = auVar151._0_4_;
            fVar208 = fVar209 + fVar209;
            fVar153 = auVar151._4_4_;
            fVar148 = fVar153 + fVar153;
            fVar154 = auVar151._8_4_;
            fVar152 = fVar154 + fVar154;
            fVar204 = auVar151._12_4_;
            fVar155 = fVar204 + fVar204;
            fVar205 = auVar151._16_4_;
            fVar156 = fVar205 + fVar205;
            fVar206 = auVar151._20_4_;
            fVar157 = fVar206 + fVar206;
            fVar207 = auVar151._24_4_;
            fVar158 = fVar207 + fVar207;
            fVar96 = auVar151._28_4_ + auVar151._28_4_;
            in_ZMM4 = ZEXT3264(CONCAT428(fVar96,CONCAT424(fVar158,CONCAT420(fVar157,CONCAT416(
                                                  fVar156,CONCAT412(fVar155,CONCAT48(fVar152,
                                                  CONCAT44(fVar148,fVar208))))))));
            auVar78._4_4_ = auVar113._4_4_ * fVar148;
            auVar78._0_4_ = auVar113._0_4_ * fVar208;
            auVar78._8_4_ = auVar113._8_4_ * fVar152;
            auVar78._12_4_ = auVar113._12_4_ * fVar155;
            auVar78._16_4_ = auVar113._16_4_ * fVar156;
            auVar78._20_4_ = auVar113._20_4_ * fVar157;
            auVar78._24_4_ = auVar113._24_4_ * fVar158;
            auVar78._28_4_ = auVar113._28_4_;
            auVar151._8_4_ = 2.0;
            auVar151._0_8_ = 0x4000000040000000;
            auVar151._12_4_ = 2.0;
            auVar151._16_4_ = 2.0;
            auVar151._20_4_ = 2.0;
            auVar151._24_4_ = 2.0;
            auVar151._28_4_ = 2.0;
            auVar78 = vsubps_avx(auVar151,auVar78);
            auVar135._0_4_ = fVar208 + -1.0;
            auVar135._4_4_ = fVar148 + -1.0;
            auVar135._8_4_ = fVar152 + -1.0;
            auVar135._12_4_ = fVar155 + -1.0;
            auVar135._16_4_ = fVar156 + -1.0;
            auVar135._20_4_ = fVar157 + -1.0;
            auVar135._24_4_ = fVar158 + -1.0;
            auVar135._28_4_ = fVar96 + -1.0;
            auVar110._0_4_ = auVar135._0_4_ + fVar209 * auVar78._0_4_;
            auVar110._4_4_ = auVar135._4_4_ + fVar153 * auVar78._4_4_;
            auVar110._8_4_ = auVar135._8_4_ + fVar154 * auVar78._8_4_;
            auVar110._12_4_ = auVar135._12_4_ + fVar204 * auVar78._12_4_;
            auVar110._16_4_ = auVar135._16_4_ + fVar205 * auVar78._16_4_;
            auVar110._20_4_ = auVar135._20_4_ + fVar206 * auVar78._20_4_;
            auVar110._24_4_ = auVar135._24_4_ + fVar207 * auVar78._24_4_;
            goto LAB_004a1480;
          case 6:
            fVar209 = **(float **)(&this->field_0xf8 + (long)p_Var12);
            fVar153 = (*(float **)(&this->field_0xf8 + (long)p_Var12))[1];
            auVar135._4_4_ = fVar153;
            auVar135._0_4_ = fVar153;
            auVar135._8_4_ = fVar153;
            auVar135._12_4_ = fVar153;
            auVar135._16_4_ = fVar153;
            auVar135._20_4_ = fVar153;
            auVar135._24_4_ = fVar153;
            auVar135._28_4_ = fVar153;
            auVar119._0_4_ = fVar209 * fVar202 + fVar153;
            auVar119._4_4_ = fVar209 * fVar203 + fVar153;
            auVar119._8_4_ = fVar209 * auVar92._8_4_ + fVar153;
            auVar119._12_4_ = fVar209 * auVar92._12_4_ + fVar153;
            auVar119._16_4_ = fVar209 * auVar92._16_4_ + fVar153;
            auVar119._20_4_ = fVar209 * auVar92._20_4_ + fVar153;
            auVar119._24_4_ = fVar209 * auVar92._24_4_ + fVar153;
            auVar119._28_4_ = fVar209 + fVar153;
            auVar78 = vmaxps_avx(auVar119,auVar78);
            auVar78 = vminps_avx(auVar78,auVar147);
            auVar110 = auVar78._0_28_;
LAB_004a1480:
            in_ZMM3 = ZEXT3264(auVar135);
            auVar25._4_4_ = auVar110._4_4_ * fVar203;
            auVar25._0_4_ = auVar110._0_4_ * fVar202;
            auVar25._8_4_ = auVar110._8_4_ * auVar92._8_4_;
            auVar25._12_4_ = auVar110._12_4_ * auVar92._12_4_;
            auVar25._16_4_ = auVar110._16_4_ * auVar92._16_4_;
            auVar25._20_4_ = auVar110._20_4_ * auVar92._20_4_;
            auVar25._24_4_ = auVar110._24_4_ * auVar92._24_4_;
            auVar25._28_4_ = auVar151._28_4_;
            auVar151 = auVar25;
          }
switchD_004a0fd9_caseD_1:
          auVar137 = auVar151._16_16_;
          auVar121 = auVar151._0_16_;
          if (iVar72 == 1) {
            *(int *)*local_218 = auVar151._0_4_;
            uVar11 = vextractps_avx(auVar121,1);
            *(undefined4 *)((long)*local_218 + lVar63 * 4) = uVar11;
            uVar11 = vextractps_avx(auVar121,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 2) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar121,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 3) * 4) = uVar11;
            *(int *)((long)*local_218 + (long)(iVar40 * 4) * 4) = auVar151._16_4_;
            uVar11 = vextractps_avx(auVar137,1);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 5) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar137,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 6) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar137,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 7) * 4) = uVar11;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 4);
          }
          else if (iVar72 == 4) {
            *(undefined1 (*) [16])*local_218 = auVar121;
            *(undefined1 (*) [16])((long)*local_218 + lVar63 * 4) = auVar137;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 0x10);
          }
          else if (iVar72 == 8) {
            *local_218 = auVar151;
            local_218 = local_218 + 1;
          }
          iVar51 = iVar51 + local_88.elempack * iVar9;
          local_1d8 = local_1d8 + lVar1;
          local_200 = local_200 + lVar1;
        }
      }
      uVar31 = (long)(iVar53 + iVar52 * -8) / 4;
      lVar58 = lVar42 * uVar73 * 4;
      uVar64 = 0;
      iVar51 = (int)uVar31;
      uVar57 = 0;
      if (0 < iVar51) {
        uVar57 = uVar31 & 0xffffffff;
      }
      auVar79 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar186 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar193._8_4_ = 0x3f800000;
      auVar193._0_8_ = 0x3f8000003f800000;
      auVar193._12_4_ = 0x3f800000;
      for (; uVar64 != uVar57; uVar64 = uVar64 + 1) {
        uVar31 = (long)(iVar52 * 8) + uVar64 * 4;
        uVar46 = top_blob->w;
        iVar29 = top_blob->elempack;
        uVar44 = (int)uVar31 >> 0x1f;
        local_218 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)uVar44 << 0x20 | uVar31 & 0xffffffff) / (long)iVar29)
                     * (long)(int)uVar46 * top_blob->elemsize + (long)top_blob->data);
        uVar70 = (ulong)uVar44 << 0x20 | uVar31 & 0xffffffff;
        lVar65 = (long)local_88.h * (long)local_88.elempack;
        lVar43 = 0;
        uVar59 = 0;
        if (0 < (int)uVar46) {
          uVar59 = (ulong)uVar46;
        }
        iVar55 = 0;
        local_1d8 = lVar48 * 4;
        for (uVar66 = 0; uVar66 != uVar59; uVar66 = uVar66 + 1) {
          fVar209 = 0.0;
          fVar153 = 0.0;
          fVar205 = 0.0;
          fVar206 = 0.0;
          fVar154 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          if (lVar60 != 0) {
            pfVar54 = (float *)(lVar60 + uVar31 * 4);
            fVar154 = *pfVar54;
            fVar202 = pfVar54[1];
            fVar203 = pfVar54[2];
            fVar204 = pfVar54[3];
          }
          pfVar69 = (float *)((this->weight_data_tm).cstep *
                              (long)(((int)((long)uVar70 % 8) >> 2) + (int)((long)uVar70 / 8)) *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_200._0_4_ = (int)uVar66;
          local_200._0_4_ = local_88.elempack * iVar9 * (int)local_200;
          lVar47 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar32 = (long)local_88.data + local_1d8;
          pfVar54 = (float *)((long)local_88.data + lVar43);
          uVar61 = 0;
          auVar181 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar187 = ZEXT1664(ZEXT816(0) << 0x40);
          while( true ) {
            local_210 = (int)lVar65;
            if (local_210 <= (int)((uint)uVar61 | 7)) break;
            lVar34 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                 uVar61 & 0xffffffff) / (long)local_88.elempack) * lVar47;
            if (local_88.elempack == 8) {
              pfVar33 = (float *)((long)local_88.data + lVar34 + (long)iVar55 * 4);
              uVar35 = uVar73;
              pfVar37 = pfVar69;
              while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
                fVar207 = *pfVar33;
                fVar208 = pfVar33[1];
                fVar148 = pfVar33[2];
                fVar152 = pfVar33[3];
                fVar155 = pfVar33[4];
                fVar156 = pfVar33[5];
                fVar154 = fVar207 * *pfVar37 + fVar154 + fVar155 * pfVar37[0x10];
                fVar202 = fVar207 * pfVar37[1] + fVar202 + fVar155 * pfVar37[0x11];
                fVar203 = fVar207 * pfVar37[2] + fVar203 + fVar155 * pfVar37[0x12];
                fVar204 = fVar207 * pfVar37[3] + fVar204 + fVar155 * pfVar37[0x13];
                fVar207 = pfVar33[6];
                auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar37[7] + auVar187._12_4_ +
                                              fVar156 * pfVar37[0x17],
                                              CONCAT48(fVar208 * pfVar37[6] + auVar187._8_4_ +
                                                       fVar156 * pfVar37[0x16],
                                                       CONCAT44(fVar208 * pfVar37[5] +
                                                                auVar187._4_4_ +
                                                                fVar156 * pfVar37[0x15],
                                                                fVar208 * pfVar37[4] +
                                                                auVar187._0_4_ +
                                                                fVar156 * pfVar37[0x14]))));
                fVar208 = pfVar33[7];
                auVar181 = ZEXT1664(CONCAT412(fVar148 * pfVar37[0xb] + auVar181._12_4_ +
                                              fVar207 * pfVar37[0x1b],
                                              CONCAT48(fVar148 * pfVar37[10] + auVar181._8_4_ +
                                                       fVar207 * pfVar37[0x1a],
                                                       CONCAT44(fVar148 * pfVar37[9] +
                                                                auVar181._4_4_ +
                                                                fVar207 * pfVar37[0x19],
                                                                fVar148 * pfVar37[8] +
                                                                auVar181._0_4_ +
                                                                fVar207 * pfVar37[0x18]))));
                fVar205 = fVar208 * pfVar37[0x1c] + fVar152 * pfVar37[0xc] + fVar205;
                fVar206 = fVar208 * pfVar37[0x1d] + fVar152 * pfVar37[0xd] + fVar206;
                fVar209 = fVar208 * pfVar37[0x1e] + fVar152 * pfVar37[0xe] + fVar209;
                fVar153 = fVar208 * pfVar37[0x1f] + fVar152 * pfVar37[0xf] + fVar153;
                pfVar37 = pfVar37 + 0x20;
                pfVar33 = pfVar33 + iVar26;
              }
              pfVar69 = pfVar69 + uVar73 * 0x20;
            }
            else {
              pfVar33 = (float *)((long)local_88.data + lVar34 + (long)(int)local_200 * 4);
            }
            if (local_88.elempack == 4) {
              pfVar37 = pfVar33 + 3;
              pfVar38 = pfVar69;
              uVar35 = uVar73;
              while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
                fVar207 = pfVar37[-3];
                fVar208 = pfVar37[-2];
                fVar148 = pfVar37[-1];
                fVar152 = *pfVar37;
                fVar155 = pfVar37[lVar48 + -3];
                fVar156 = pfVar37[lVar48 + -2];
                fVar154 = fVar207 * *pfVar38 + fVar154 + fVar155 * pfVar38[0x10];
                fVar202 = fVar207 * pfVar38[1] + fVar202 + fVar155 * pfVar38[0x11];
                fVar203 = fVar207 * pfVar38[2] + fVar203 + fVar155 * pfVar38[0x12];
                fVar204 = fVar207 * pfVar38[3] + fVar204 + fVar155 * pfVar38[0x13];
                fVar207 = pfVar37[lVar48 + -1];
                auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar38[7] + auVar187._12_4_ +
                                              fVar156 * pfVar38[0x17],
                                              CONCAT48(fVar208 * pfVar38[6] + auVar187._8_4_ +
                                                       fVar156 * pfVar38[0x16],
                                                       CONCAT44(fVar208 * pfVar38[5] +
                                                                auVar187._4_4_ +
                                                                fVar156 * pfVar38[0x15],
                                                                fVar208 * pfVar38[4] +
                                                                auVar187._0_4_ +
                                                                fVar156 * pfVar38[0x14]))));
                fVar208 = pfVar37[lVar48];
                auVar181 = ZEXT1664(CONCAT412(fVar148 * pfVar38[0xb] + auVar181._12_4_ +
                                              fVar207 * pfVar38[0x1b],
                                              CONCAT48(fVar148 * pfVar38[10] + auVar181._8_4_ +
                                                       fVar207 * pfVar38[0x1a],
                                                       CONCAT44(fVar148 * pfVar38[9] +
                                                                auVar181._4_4_ +
                                                                fVar207 * pfVar38[0x19],
                                                                fVar148 * pfVar38[8] +
                                                                auVar181._0_4_ +
                                                                fVar207 * pfVar38[0x18]))));
                fVar205 = fVar208 * pfVar38[0x1c] + fVar152 * pfVar38[0xc] + fVar205;
                fVar206 = fVar208 * pfVar38[0x1d] + fVar152 * pfVar38[0xd] + fVar206;
                fVar209 = fVar208 * pfVar38[0x1e] + fVar152 * pfVar38[0xe] + fVar209;
                fVar153 = fVar208 * pfVar38[0x1f] + fVar152 * pfVar38[0xf] + fVar153;
                pfVar38 = pfVar38 + 0x20;
                pfVar37 = pfVar37 + lVar42;
              }
              pfVar69 = pfVar69 + uVar73 * 0x20;
              pfVar33 = (float *)((long)pfVar33 + lVar58);
            }
            uVar35 = uVar73;
            pfVar37 = pfVar69;
            if (local_88.elempack == 1) {
              while ((int)uVar35 != 0) {
                fVar207 = *pfVar33;
                fVar208 = pfVar33[lVar48];
                fVar148 = pfVar33[iVar23];
                fVar152 = pfVar33[iVar8];
                fVar155 = pfVar33[iVar27];
                fVar156 = pfVar33[iVar18];
                fVar154 = fVar207 * *pfVar37 + fVar154 + fVar155 * pfVar37[0x10];
                fVar202 = fVar207 * pfVar37[1] + fVar202 + fVar155 * pfVar37[0x11];
                fVar203 = fVar207 * pfVar37[2] + fVar203 + fVar155 * pfVar37[0x12];
                fVar204 = fVar207 * pfVar37[3] + fVar204 + fVar155 * pfVar37[0x13];
                fVar207 = pfVar33[iVar28];
                auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar37[7] + auVar187._12_4_ +
                                              fVar156 * pfVar37[0x17],
                                              CONCAT48(fVar208 * pfVar37[6] + auVar187._8_4_ +
                                                       fVar156 * pfVar37[0x16],
                                                       CONCAT44(fVar208 * pfVar37[5] +
                                                                auVar187._4_4_ +
                                                                fVar156 * pfVar37[0x15],
                                                                fVar208 * pfVar37[4] +
                                                                auVar187._0_4_ +
                                                                fVar156 * pfVar37[0x14]))));
                fVar208 = pfVar33[iVar39];
                auVar181 = ZEXT1664(CONCAT412(fVar148 * pfVar37[0xb] + auVar181._12_4_ +
                                              fVar207 * pfVar37[0x1b],
                                              CONCAT48(fVar148 * pfVar37[10] + auVar181._8_4_ +
                                                       fVar207 * pfVar37[0x1a],
                                                       CONCAT44(fVar148 * pfVar37[9] +
                                                                auVar181._4_4_ +
                                                                fVar207 * pfVar37[0x19],
                                                                fVar148 * pfVar37[8] +
                                                                auVar181._0_4_ +
                                                                fVar207 * pfVar37[0x18]))));
                fVar205 = fVar208 * pfVar37[0x1c] + fVar152 * pfVar37[0xc] + fVar205;
                fVar206 = fVar208 * pfVar37[0x1d] + fVar152 * pfVar37[0xd] + fVar206;
                fVar209 = fVar208 * pfVar37[0x1e] + fVar152 * pfVar37[0xe] + fVar209;
                fVar153 = fVar208 * pfVar37[0x1f] + fVar152 * pfVar37[0xf] + fVar153;
                pfVar33 = pfVar33 + lVar49;
                uVar35 = (ulong)((int)uVar35 - 1);
                pfVar37 = pfVar37 + 0x20;
              }
              pfVar69 = pfVar69 + uVar73 * 0x20;
            }
            uVar61 = uVar61 + 8;
            lVar32 = lVar32 + lVar47 * 8;
            pfVar54 = pfVar54 + lVar47 * 2;
          }
          for (; (int)((uint)uVar61 | 3) < local_210; uVar61 = uVar61 + 4) {
            lVar34 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                 uVar61 & 0xffffffff) / (long)local_88.elempack) * lVar47;
            if (local_88.elempack == 4) {
              pfVar33 = (float *)((long)local_88.data + lVar34 + (long)iVar55 * 4);
              uVar35 = uVar73;
              pfVar37 = pfVar69;
              while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
                fVar207 = *pfVar33;
                fVar208 = pfVar33[1];
                fVar154 = fVar207 * *pfVar37 + fVar154;
                fVar202 = fVar207 * pfVar37[1] + fVar202;
                fVar203 = fVar207 * pfVar37[2] + fVar203;
                fVar204 = fVar207 * pfVar37[3] + fVar204;
                fVar207 = pfVar33[2];
                auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar37[7] + auVar187._12_4_,
                                              CONCAT48(fVar208 * pfVar37[6] + auVar187._8_4_,
                                                       CONCAT44(fVar208 * pfVar37[5] +
                                                                auVar187._4_4_,
                                                                fVar208 * pfVar37[4] +
                                                                auVar187._0_4_))));
                fVar208 = pfVar33[3];
                auVar181 = ZEXT1664(CONCAT412(fVar207 * pfVar37[0xb] + auVar181._12_4_,
                                              CONCAT48(fVar207 * pfVar37[10] + auVar181._8_4_,
                                                       CONCAT44(fVar207 * pfVar37[9] +
                                                                auVar181._4_4_,
                                                                fVar207 * pfVar37[8] +
                                                                auVar181._0_4_))));
                fVar205 = fVar208 * pfVar37[0xc] + fVar205;
                fVar206 = fVar208 * pfVar37[0xd] + fVar206;
                fVar209 = fVar208 * pfVar37[0xe] + fVar209;
                fVar153 = fVar208 * pfVar37[0xf] + fVar153;
                pfVar37 = pfVar37 + 0x10;
                pfVar33 = pfVar33 + lVar42;
              }
              pfVar69 = pfVar69 + uVar73 * 0x10;
            }
            else {
              pfVar33 = (float *)((long)local_88.data + lVar34 + (long)(int)local_200 * 4);
            }
            uVar35 = uVar73;
            pfVar37 = pfVar69;
            if (local_88.elempack == 1) {
              while ((int)uVar35 != 0) {
                fVar207 = *pfVar33;
                fVar208 = pfVar33[lVar48];
                fVar154 = fVar207 * *pfVar37 + fVar154;
                fVar202 = fVar207 * pfVar37[1] + fVar202;
                fVar203 = fVar207 * pfVar37[2] + fVar203;
                fVar204 = fVar207 * pfVar37[3] + fVar204;
                fVar207 = pfVar33[iVar23];
                auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar37[7] + auVar187._12_4_,
                                              CONCAT48(fVar208 * pfVar37[6] + auVar187._8_4_,
                                                       CONCAT44(fVar208 * pfVar37[5] +
                                                                auVar187._4_4_,
                                                                fVar208 * pfVar37[4] +
                                                                auVar187._0_4_))));
                fVar208 = pfVar33[iVar8];
                auVar181 = ZEXT1664(CONCAT412(fVar207 * pfVar37[0xb] + auVar181._12_4_,
                                              CONCAT48(fVar207 * pfVar37[10] + auVar181._8_4_,
                                                       CONCAT44(fVar207 * pfVar37[9] +
                                                                auVar181._4_4_,
                                                                fVar207 * pfVar37[8] +
                                                                auVar181._0_4_))));
                fVar205 = fVar208 * pfVar37[0xc] + fVar205;
                fVar206 = fVar208 * pfVar37[0xd] + fVar206;
                fVar209 = fVar208 * pfVar37[0xe] + fVar209;
                fVar153 = fVar208 * pfVar37[0xf] + fVar153;
                pfVar33 = pfVar33 + lVar49;
                uVar35 = (ulong)((int)uVar35 - 1);
                pfVar37 = pfVar37 + 0x10;
              }
              pfVar69 = pfVar69 + uVar73 * 0x10;
            }
            lVar32 = lVar32 + lVar47 * 4;
            pfVar54 = pfVar54 + lVar47;
          }
          for (; (long)(uVar61 | 1) < lVar65; uVar61 = uVar61 + 2) {
            lVar34 = 0;
            uVar35 = uVar73;
            pfVar33 = pfVar69;
            while (iVar45 = (int)uVar35, uVar35 = (ulong)(iVar45 - 1), iVar45 != 0) {
              fVar207 = *(float *)((long)pfVar54 + lVar34);
              fVar208 = *(float *)(lVar32 + lVar34);
              fVar154 = fVar207 * *pfVar33 + fVar154;
              fVar202 = fVar207 * pfVar33[1] + fVar202;
              fVar203 = fVar207 * pfVar33[2] + fVar203;
              fVar204 = fVar207 * pfVar33[3] + fVar204;
              auVar187 = ZEXT1664(CONCAT412(fVar208 * pfVar33[7] + auVar187._12_4_,
                                            CONCAT48(fVar208 * pfVar33[6] + auVar187._8_4_,
                                                     CONCAT44(fVar208 * pfVar33[5] + auVar187._4_4_,
                                                              fVar208 * pfVar33[4] + auVar187._0_4_)
                                                    )));
              pfVar33 = pfVar33 + 8;
              lVar34 = lVar34 + lVar50;
            }
            pfVar69 = pfVar69 + uVar73 * 8;
            lVar32 = lVar32 + lVar47 * 2;
            pfVar54 = (float *)((long)pfVar54 + lVar47 * 2);
          }
          for (; uVar35 = uVar73, pfVar33 = pfVar54, pfVar37 = pfVar69, (long)uVar61 < lVar65;
              uVar61 = uVar61 + 1) {
            while ((int)uVar35 != 0) {
              fVar207 = *pfVar33;
              fVar154 = fVar207 * *pfVar37 + fVar154;
              fVar202 = fVar207 * pfVar37[1] + fVar202;
              fVar203 = fVar207 * pfVar37[2] + fVar203;
              fVar204 = fVar207 * pfVar37[3] + fVar204;
              uVar35 = (ulong)((int)uVar35 - 1);
              pfVar33 = pfVar33 + lVar49;
              pfVar37 = pfVar37 + 4;
            }
            pfVar69 = pfVar69 + uVar73 * 4;
            pfVar54 = (float *)((long)pfVar54 + lVar47);
          }
          auVar122._0_4_ = auVar187._0_4_ + fVar154 + auVar181._0_4_ + fVar205;
          auVar122._4_4_ = auVar187._4_4_ + fVar202 + auVar181._4_4_ + fVar206;
          auVar122._8_4_ = auVar187._8_4_ + fVar203 + auVar181._8_4_ + fVar209;
          auVar122._12_4_ = auVar187._12_4_ + fVar204 + auVar181._12_4_ + fVar153;
          auVar168 = auVar122;
          if (5 < iVar10 - 1U) goto switchD_004a1c52_caseD_1;
          auVar173 = auVar79._0_16_;
          auVar168 = vmaxps_avx(auVar122,auVar173);
          fVar209 = auVar186._0_4_;
          fVar153 = auVar186._4_4_;
          fVar154 = auVar186._8_4_;
          fVar202 = auVar186._12_4_;
          switch(iVar10) {
          case 2:
            auVar173 = vminps_avx(auVar122,auVar173);
            fVar209 = **(float **)(&this->field_0xf8 + (long)p_Var12);
            auVar160._0_4_ = auVar168._0_4_ + fVar209 * auVar173._0_4_;
            auVar160._4_4_ = auVar168._4_4_ + fVar209 * auVar173._4_4_;
            auVar160._8_4_ = auVar168._8_4_ + fVar209 * auVar173._8_4_;
            auVar160._12_4_ = auVar168._12_4_ + fVar209 * auVar173._12_4_;
            auVar168 = auVar160;
            break;
          case 3:
            uVar11 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var12);
            auVar165._4_4_ = uVar11;
            auVar165._0_4_ = uVar11;
            auVar165._8_4_ = uVar11;
            auVar165._12_4_ = uVar11;
            uVar11 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var12))[1];
            auVar178._4_4_ = uVar11;
            auVar178._0_4_ = uVar11;
            auVar178._8_4_ = uVar11;
            auVar178._12_4_ = uVar11;
            auVar173 = vmaxps_avx(auVar165,auVar122);
            auVar168 = vminps_avx(auVar178,auVar173);
            break;
          case 4:
            uVar61 = CONCAT44(auVar122._4_4_,auVar122._0_4_);
            auVar123._0_8_ = uVar61 ^ 0x8000000080000000;
            auVar123._8_4_ = -auVar122._8_4_;
            auVar123._12_4_ = -auVar122._12_4_;
            auVar83._8_4_ = 0x42b0c0a5;
            auVar83._0_8_ = 0x42b0c0a542b0c0a5;
            auVar83._12_4_ = 0x42b0c0a5;
            auVar173 = vminps_avx(auVar123,auVar83);
            auVar84._8_4_ = 0xc2b0c0a5;
            auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar84._12_4_ = 0xc2b0c0a5;
            auVar137 = vmaxps_avx(auVar173,auVar84);
            auVar166._0_4_ = auVar137._0_4_ * 1.442695 + fVar209;
            auVar166._4_4_ = auVar137._4_4_ * 1.442695 + fVar153;
            auVar166._8_4_ = auVar137._8_4_ * 1.442695 + fVar154;
            auVar166._12_4_ = auVar137._12_4_ * 1.442695 + fVar202;
            auVar179._0_4_ = (int)auVar166._0_4_;
            auVar179._4_4_ = (int)auVar166._4_4_;
            auVar179._8_4_ = (int)auVar166._8_4_;
            auVar179._12_4_ = (int)auVar166._12_4_;
            auVar121 = vcvtdq2ps_avx(auVar179);
            auVar173 = vcmpps_avx(auVar166,auVar121,1);
            auVar191._8_4_ = 0x3f800000;
            auVar191._0_8_ = 0x3f8000003f800000;
            auVar191._12_4_ = 0x3f800000;
            auVar173 = vandps_avx(auVar173,auVar191);
            auVar173 = vsubps_avx(auVar121,auVar173);
            fVar203 = auVar173._0_4_ * -0.6931472 + auVar137._0_4_;
            fVar204 = auVar173._4_4_ * -0.6931472 + auVar137._4_4_;
            fVar205 = auVar173._8_4_ * -0.6931472 + auVar137._8_4_;
            fVar206 = auVar173._12_4_ * -0.6931472 + auVar137._12_4_;
            auVar167._0_4_ = (int)auVar173._0_4_;
            auVar167._4_4_ = (int)auVar173._4_4_;
            auVar167._8_4_ = (int)auVar173._8_4_;
            auVar167._12_4_ = (int)auVar173._12_4_;
            auVar173 = vpslld_avx(auVar167,0x17);
            auVar173 = vpaddd_avx(auVar173,auVar191);
            auVar124._0_4_ =
                 auVar173._0_4_ *
                 (fVar203 * fVar203 *
                  (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                    0.041665796) * fVar203 + 0.16666666) * fVar203 + fVar209) + fVar203 + 1.0) + 1.0
            ;
            auVar124._4_4_ =
                 auVar173._4_4_ *
                 (fVar204 * fVar204 *
                  (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                    0.041665796) * fVar204 + 0.16666666) * fVar204 + fVar153) + fVar204 + 1.0) + 1.0
            ;
            auVar124._8_4_ =
                 auVar173._8_4_ *
                 (fVar205 * fVar205 *
                  (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                    0.041665796) * fVar205 + 0.16666666) * fVar205 + fVar154) + fVar205 + 1.0) + 1.0
            ;
            auVar124._12_4_ =
                 auVar173._12_4_ *
                 (fVar206 * fVar206 *
                  (((((fVar206 * 0.00019875691 + 0.0013981999) * fVar206 + 0.008333452) * fVar206 +
                    0.041665796) * fVar206 + 0.16666666) * fVar206 + fVar202) + fVar206 + 1.0) + 1.0
            ;
            auVar173 = vrcpps_avx(auVar124);
            fVar209 = auVar173._0_4_;
            auVar125._0_4_ = fVar209 * auVar124._0_4_;
            fVar153 = auVar173._4_4_;
            auVar125._4_4_ = fVar153 * auVar124._4_4_;
            fVar154 = auVar173._8_4_;
            auVar125._8_4_ = fVar154 * auVar124._8_4_;
            fVar202 = auVar173._12_4_;
            auVar125._12_4_ = fVar202 * auVar124._12_4_;
            auVar173 = vsubps_avx(auVar191,auVar125);
            auVar168._0_4_ = fVar209 + fVar209 * auVar173._0_4_;
            auVar168._4_4_ = fVar153 + fVar153 * auVar173._4_4_;
            auVar168._8_4_ = fVar154 + fVar154 * auVar173._8_4_;
            auVar168._12_4_ = fVar202 + fVar202 * auVar173._12_4_;
            break;
          case 5:
            auVar81._8_4_ = 0x42b0c0a5;
            auVar81._0_8_ = 0x42b0c0a542b0c0a5;
            auVar81._12_4_ = 0x42b0c0a5;
            auVar173 = vminps_avx(auVar122,auVar81);
            auVar140._8_4_ = 0xc2b0c0a5;
            auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar140._12_4_ = 0xc2b0c0a5;
            auVar137 = vmaxps_avx(auVar173,auVar140);
            auVar171._0_4_ = auVar137._0_4_ * 1.442695 + fVar209;
            auVar171._4_4_ = auVar137._4_4_ * 1.442695 + fVar153;
            auVar171._8_4_ = auVar137._8_4_ * 1.442695 + fVar154;
            auVar171._12_4_ = auVar137._12_4_ * 1.442695 + fVar202;
            auVar182._0_4_ = (int)auVar171._0_4_;
            auVar182._4_4_ = (int)auVar171._4_4_;
            auVar182._8_4_ = (int)auVar171._8_4_;
            auVar182._12_4_ = (int)auVar171._12_4_;
            auVar121 = vcvtdq2ps_avx(auVar182);
            auVar173 = vcmpps_avx(auVar171,auVar121,1);
            auVar173 = vandps_avx(auVar173,auVar193);
            auVar173 = vsubps_avx(auVar121,auVar173);
            auVar183._0_4_ = auVar173._0_4_ * 0.6931472;
            auVar183._4_4_ = auVar173._4_4_ * 0.6931472;
            auVar183._8_4_ = auVar173._8_4_ * 0.6931472;
            auVar183._12_4_ = auVar173._12_4_ * 0.6931472;
            auVar121 = vsubps_avx(auVar137,auVar183);
            fVar203 = auVar121._0_4_;
            fVar204 = auVar121._4_4_;
            fVar205 = auVar121._8_4_;
            fVar206 = auVar121._12_4_;
            auVar172._0_4_ = (int)auVar173._0_4_;
            auVar172._4_4_ = (int)auVar173._4_4_;
            auVar172._8_4_ = (int)auVar173._8_4_;
            auVar172._12_4_ = (int)auVar173._12_4_;
            auVar173 = vpslld_avx(auVar172,0x17);
            auVar173 = vpaddd_avx(auVar173,auVar193);
            auVar161._0_4_ =
                 (fVar203 + 1.0 +
                 fVar203 * fVar203 *
                 (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                   0.041665796) * fVar203 + 0.16666666) * fVar203 + fVar209)) * auVar173._0_4_ + 1.0
            ;
            auVar161._4_4_ =
                 (fVar204 + 1.0 +
                 fVar204 * fVar204 *
                 (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                   0.041665796) * fVar204 + 0.16666666) * fVar204 + fVar153)) * auVar173._4_4_ + 1.0
            ;
            auVar161._8_4_ =
                 (fVar205 + 1.0 +
                 fVar205 * fVar205 *
                 (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                   0.041665796) * fVar205 + 0.16666666) * fVar205 + fVar154)) * auVar173._8_4_ + 1.0
            ;
            auVar161._12_4_ =
                 (fVar206 + 1.0 +
                 fVar206 * fVar206 *
                 (((((fVar206 * 0.00019875691 + 0.0013981999) * fVar206 + 0.008333452) * fVar206 +
                   0.041665796) * fVar206 + 0.16666666) * fVar206 + fVar202)) * auVar173._12_4_ +
                 1.0;
            auVar174._8_4_ = 0x800000;
            auVar174._0_8_ = 0x80000000800000;
            auVar174._12_4_ = 0x800000;
            auVar173 = vmaxps_avx(auVar161,auVar174);
            auVar121 = vpsrld_avx(auVar173,0x17);
            auVar188._8_4_ = 0xffffff82;
            auVar188._0_8_ = 0xffffff82ffffff82;
            auVar188._12_4_ = 0xffffff82;
            auVar121 = vpaddd_avx(auVar121,auVar188);
            auVar189._8_4_ = 0x807fffff;
            auVar189._0_8_ = 0x807fffff807fffff;
            auVar189._12_4_ = 0x807fffff;
            auVar173 = vandps_avx(auVar173,auVar189);
            auVar138 = vorps_avx(auVar173,auVar186._0_16_);
            auVar137 = vcvtdq2ps_avx(auVar121);
            auVar190._8_4_ = 0x3f3504f3;
            auVar190._0_8_ = 0x3f3504f33f3504f3;
            auVar190._12_4_ = 0x3f3504f3;
            auVar121 = vcmpps_avx(auVar138,auVar190,1);
            auVar173 = vandps_avx(auVar121,auVar138);
            fVar203 = auVar138._0_4_ + -1.0 + auVar173._0_4_;
            fVar204 = auVar138._4_4_ + -1.0 + auVar173._4_4_;
            fVar205 = auVar138._8_4_ + -1.0 + auVar173._8_4_;
            fVar206 = auVar138._12_4_ + -1.0 + auVar173._12_4_;
            auVar173 = vandps_avx(auVar121,auVar193);
            auVar121 = vsubps_avx(auVar137,auVar173);
            auVar173 = vcmpps_avx(auVar161,_DAT_004eb480,2);
            auVar175._0_4_ =
                 (auVar121._0_4_ * 0.6931472 + fVar203 +
                 fVar203 * fVar203 *
                 (((((((((fVar203 * 0.070376836 + -0.1151461) * fVar203 + 0.116769984) * fVar203 +
                       -0.12420141) * fVar203 + 0.14249323) * fVar203 + -0.16668057) * fVar203 +
                    0.20000714) * fVar203 + -0.24999994) * fVar203 + 0.3333333) * fVar203 + -0.5)) *
                 -2.0;
            auVar175._4_4_ =
                 (auVar121._4_4_ * 0.6931472 + fVar204 +
                 fVar204 * fVar204 *
                 (((((((((fVar204 * 0.070376836 + -0.1151461) * fVar204 + 0.116769984) * fVar204 +
                       -0.12420141) * fVar204 + 0.14249323) * fVar204 + -0.16668057) * fVar204 +
                    0.20000714) * fVar204 + -0.24999994) * fVar204 + 0.3333333) * fVar204 + -0.5)) *
                 -2.0;
            auVar175._8_4_ =
                 (auVar121._8_4_ * 0.6931472 + fVar205 +
                 fVar205 * fVar205 *
                 (((((((((fVar205 * 0.070376836 + -0.1151461) * fVar205 + 0.116769984) * fVar205 +
                       -0.12420141) * fVar205 + 0.14249323) * fVar205 + -0.16668057) * fVar205 +
                    0.20000714) * fVar205 + -0.24999994) * fVar205 + 0.3333333) * fVar205 + -0.5)) *
                 -2.0;
            auVar175._12_4_ =
                 (auVar121._12_4_ * 0.6931472 + fVar206 +
                 fVar206 * fVar206 *
                 (((((((((fVar206 * 0.070376836 + -0.1151461) * fVar206 + 0.116769984) * fVar206 +
                       -0.12420141) * fVar206 + 0.14249323) * fVar206 + -0.16668057) * fVar206 +
                    0.20000714) * fVar206 + -0.24999994) * fVar206 + 0.3333333) * fVar206 + -0.5)) *
                 -2.0;
            auVar141._8_4_ = 0x7fffffff;
            auVar141._0_8_ = 0x7fffffff7fffffff;
            auVar141._12_4_ = 0x7fffffff;
            auVar173 = vblendvps_avx(auVar175,auVar141,auVar173);
            auVar142._8_4_ = 0x42b0c0a5;
            auVar142._0_8_ = 0x42b0c0a542b0c0a5;
            auVar142._12_4_ = 0x42b0c0a5;
            auVar173 = vminps_avx(auVar173,auVar142);
            auVar143._8_4_ = 0xc2b0c0a5;
            auVar143._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar143._12_4_ = 0xc2b0c0a5;
            in_ZMM4 = ZEXT1664(auVar143);
            auVar137 = vmaxps_avx(auVar173,auVar143);
            auVar176._0_4_ = auVar137._0_4_ * 1.442695 + fVar209;
            auVar176._4_4_ = auVar137._4_4_ * 1.442695 + fVar153;
            auVar176._8_4_ = auVar137._8_4_ * 1.442695 + fVar154;
            auVar176._12_4_ = auVar137._12_4_ * 1.442695 + fVar202;
            auVar184._0_4_ = (int)auVar176._0_4_;
            auVar184._4_4_ = (int)auVar176._4_4_;
            auVar184._8_4_ = (int)auVar176._8_4_;
            auVar184._12_4_ = (int)auVar176._12_4_;
            auVar121 = vcvtdq2ps_avx(auVar184);
            auVar173 = vcmpps_avx(auVar176,auVar121,1);
            auVar173 = vandps_avx(auVar173,auVar193);
            auVar173 = vsubps_avx(auVar121,auVar173);
            auVar185._0_4_ = auVar173._0_4_ * 0.6931472;
            auVar185._4_4_ = auVar173._4_4_ * 0.6931472;
            auVar185._8_4_ = auVar173._8_4_ * 0.6931472;
            auVar185._12_4_ = auVar173._12_4_ * 0.6931472;
            auVar121 = vsubps_avx(auVar137,auVar185);
            fVar203 = auVar121._0_4_;
            fVar204 = auVar121._4_4_;
            fVar205 = auVar121._8_4_;
            fVar206 = auVar121._12_4_;
            auVar79 = ZEXT864(0) << 0x20;
            auVar186 = ZEXT1664(auVar186._0_16_);
            auVar177._0_4_ = (int)auVar173._0_4_;
            auVar177._4_4_ = (int)auVar173._4_4_;
            auVar177._8_4_ = (int)auVar173._8_4_;
            auVar177._12_4_ = (int)auVar173._12_4_;
            auVar173 = vpslld_avx(auVar177,0x17);
            auVar173 = vpaddd_avx(auVar173,auVar193);
            auVar162._0_4_ =
                 (fVar203 + 1.0 +
                 fVar203 * fVar203 *
                 (((((fVar203 * 0.00019875691 + 0.0013981999) * fVar203 + 0.008333452) * fVar203 +
                   0.041665796) * fVar203 + 0.16666666) * fVar203 + fVar209)) * auVar173._0_4_ + 1.0
            ;
            auVar162._4_4_ =
                 (fVar204 + 1.0 +
                 fVar204 * fVar204 *
                 (((((fVar204 * 0.00019875691 + 0.0013981999) * fVar204 + 0.008333452) * fVar204 +
                   0.041665796) * fVar204 + 0.16666666) * fVar204 + fVar153)) * auVar173._4_4_ + 1.0
            ;
            auVar162._8_4_ =
                 (fVar205 + 1.0 +
                 fVar205 * fVar205 *
                 (((((fVar205 * 0.00019875691 + 0.0013981999) * fVar205 + 0.008333452) * fVar205 +
                   0.041665796) * fVar205 + 0.16666666) * fVar205 + fVar154)) * auVar173._8_4_ + 1.0
            ;
            auVar162._12_4_ =
                 (fVar206 + 1.0 +
                 fVar206 * fVar206 *
                 (((((fVar206 * 0.00019875691 + 0.0013981999) * fVar206 + 0.008333452) * fVar206 +
                   0.041665796) * fVar206 + 0.16666666) * fVar206 + fVar202)) * auVar173._12_4_ +
                 1.0;
            auVar173 = vrcpps_avx(auVar162);
            fVar209 = auVar173._0_4_;
            fVar153 = auVar173._4_4_;
            fVar154 = auVar173._8_4_;
            fVar202 = auVar173._12_4_;
            auVar163._0_4_ = auVar162._0_4_ * (fVar209 + fVar209);
            auVar163._4_4_ = auVar162._4_4_ * (fVar153 + fVar153);
            auVar163._8_4_ = auVar162._8_4_ * (fVar154 + fVar154);
            auVar163._12_4_ = auVar162._12_4_ * (fVar202 + fVar202);
            auVar82._8_4_ = 0x40000000;
            auVar82._0_8_ = 0x4000000040000000;
            auVar82._12_4_ = 0x40000000;
            auVar173 = vsubps_avx(auVar82,auVar163);
            auVar164._0_4_ = fVar209 + fVar209 + -1.0 + fVar209 * auVar173._0_4_;
            auVar164._4_4_ = fVar153 + fVar153 + -1.0 + fVar153 * auVar173._4_4_;
            auVar164._8_4_ = fVar154 + fVar154 + -1.0 + fVar154 * auVar173._8_4_;
            auVar164._12_4_ = fVar202 + fVar202 + -1.0 + fVar202 * auVar173._12_4_;
            goto LAB_004a20de;
          case 6:
            fVar209 = **(float **)(&this->field_0xf8 + (long)p_Var12);
            fVar153 = (*(float **)(&this->field_0xf8 + (long)p_Var12))[1];
            auVar169._0_4_ = fVar209 * auVar122._0_4_ + fVar153;
            auVar169._4_4_ = fVar209 * auVar122._4_4_ + fVar153;
            auVar169._8_4_ = fVar209 * auVar122._8_4_ + fVar153;
            auVar169._12_4_ = fVar209 * auVar122._12_4_ + fVar153;
            auVar173 = vmaxps_avx(auVar169,auVar173);
            auVar180._8_4_ = 0x3f800000;
            auVar180._0_8_ = 0x3f8000003f800000;
            auVar180._12_4_ = 0x3f800000;
            auVar164 = vminps_avx(auVar173,auVar180);
LAB_004a20de:
            auVar168._0_4_ = auVar164._0_4_ * auVar122._0_4_;
            auVar168._4_4_ = auVar164._4_4_ * auVar122._4_4_;
            auVar168._8_4_ = auVar164._8_4_ * auVar122._8_4_;
            auVar168._12_4_ = auVar164._12_4_ * auVar122._12_4_;
          }
switchD_004a1c52_caseD_1:
          if (iVar29 == 1) {
            *(int *)*local_218 = auVar168._0_4_;
            uVar11 = vextractps_avx(auVar168,1);
            *(undefined4 *)((long)*local_218 + lVar63 * 4) = uVar11;
            uVar11 = vextractps_avx(auVar168,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 2) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar168,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar40 * 3) * 4) = uVar11;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 4);
          }
          else if (iVar29 == 4) {
            *(undefined1 (*) [16])local_218 = auVar168;
            local_218 = (undefined1 (*) [32])((long)local_218 + 0x10);
          }
          iVar55 = iVar55 + local_88.elempack * iVar9;
          local_1d8 = local_1d8 + lVar1;
          lVar43 = lVar43 + lVar1;
        }
      }
      iVar52 = iVar52 * 8 + iVar51 * 4;
      uVar31 = (long)(iVar53 - iVar52) / 2;
      lVar63 = (long)local_88.h * (long)local_88.elempack;
      uVar46 = top_blob->w;
      lVar65 = (long)(int)uVar46 * top_blob->elemsize;
      pvVar13 = top_blob->data;
      iVar40 = local_88.elempack * iVar9;
      uVar57 = 0;
      uVar64 = 0;
      if (0 < (int)uVar46) {
        uVar64 = (ulong)uVar46;
      }
      iVar53 = (int)uVar31;
      uVar70 = 0;
      if (0 < iVar53) {
        uVar70 = uVar31 & 0xffffffff;
      }
      for (; uVar57 != uVar70; uVar57 = uVar57 + 1) {
        uVar31 = (long)iVar52 + uVar57 * 2;
        uVar46 = (int)uVar31 >> 0x1f;
        uVar59 = (ulong)uVar46 << 0x20 | uVar31 & 0xffffffff;
        puVar67 = (undefined4 *)(uVar31 * lVar65 + (long)pvVar13);
        sVar14 = (this->weight_data_tm).cstep;
        sVar15 = (this->weight_data_tm).elemsize;
        puVar71 = (undefined4 *)(((long)iVar52 + uVar57 * 2 + 1) * lVar65 + (long)pvVar13);
        pvVar16 = (this->weight_data_tm).data;
        pfVar54 = *(float **)(&this->field_0xf8 + (long)p_Var12);
        lVar32 = 0;
        iVar51 = 0;
        lVar43 = lVar48 * 4;
        for (uVar66 = 0; uVar66 != uVar64; uVar66 = uVar66 + 1) {
          if (lVar60 == 0) {
            fVar209 = 0.0;
            fVar153 = 0.0;
          }
          else {
            pfVar69 = (float *)(lVar60 + uVar31 * 4);
            fVar209 = *pfVar69;
            fVar153 = pfVar69[1];
          }
          iVar29 = iVar40 * (int)uVar66;
          lVar34 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar47 = (long)local_88.data + lVar43;
          pfVar33 = (float *)((long)local_88.data + lVar32);
          fVar154 = 0.0;
          fVar202 = 0.0;
          fVar205 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          fVar208 = 0.0;
          fVar148 = 0.0;
          fVar152 = 0.0;
          uVar61 = 0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          pfVar69 = (float *)((long)(((int)((long)((ulong)uVar46 << 0x20 | uVar31 & 0xffffffff) % 4)
                                     >> 1) + (int)((long)uVar59 / 8) +
                                    (int)(char)((char)((long)uVar59 % 8) / '\x04')) * sVar14 *
                              sVar15 + (long)pvVar16);
          while( true ) {
            local_1f8 = (int)lVar63;
            if (local_1f8 <= (int)((uint)uVar61 | 7)) break;
            lVar36 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                 uVar61 & 0xffffffff) / (long)iVar7) * lVar34;
            if (iVar7 == 8) {
              pfVar37 = (float *)((long)local_88.data + lVar36 + (long)iVar51 * 4);
              uVar35 = uVar73;
              pfVar38 = pfVar69;
              while (iVar55 = (int)uVar35, uVar35 = (ulong)(iVar55 - 1), iVar55 != 0) {
                auVar181._0_4_ = *pfVar37 * *pfVar38;
                auVar181._4_4_ = pfVar37[1] * pfVar38[1];
                auVar181._8_4_ = pfVar37[2] * pfVar38[2];
                auVar181._12_4_ = pfVar37[3] * pfVar38[3];
                auVar181._16_4_ = pfVar37[4] * pfVar38[4];
                auVar181._20_4_ = pfVar37[5] * pfVar38[5];
                auVar181._28_36_ = in_ZMM4._28_36_;
                auVar181._24_4_ = pfVar37[6] * pfVar38[6];
                fVar205 = auVar181._0_4_ + fVar205;
                fVar206 = auVar181._4_4_ + fVar206;
                fVar154 = auVar181._8_4_ + fVar154;
                fVar202 = auVar181._12_4_ + fVar202;
                fVar207 = auVar181._16_4_ + fVar207;
                fVar208 = auVar181._20_4_ + fVar208;
                fVar148 = auVar181._24_4_ + fVar148;
                fVar152 = in_ZMM4._28_4_ + fVar152;
                fVar155 = *pfVar37 * pfVar38[8] + fVar155;
                fVar156 = pfVar37[1] * pfVar38[9] + fVar156;
                fVar203 = pfVar37[2] * pfVar38[10] + fVar203;
                fVar204 = pfVar37[3] * pfVar38[0xb] + fVar204;
                fVar157 = pfVar37[4] * pfVar38[0xc] + fVar157;
                fVar158 = pfVar37[5] * pfVar38[0xd] + fVar158;
                fVar96 = pfVar37[6] * pfVar38[0xe] + fVar96;
                fVar97 = pfVar37[7] + fVar97;
                pfVar38 = pfVar38 + 0x10;
                pfVar37 = pfVar37 + iVar26;
                in_ZMM4 = ZEXT3264(auVar181._0_32_);
              }
              pfVar69 = pfVar69 + uVar73 * 0x10;
            }
            else {
              pfVar37 = (float *)((long)local_88.data + lVar36 + (long)iVar29 * 4);
            }
            uVar35 = uVar73;
            pfVar38 = pfVar69;
            pfVar62 = pfVar37;
            if (iVar7 == 4) {
              while ((int)uVar35 != 0) {
                auVar187._0_4_ = *pfVar62 * *pfVar38;
                auVar187._4_4_ = pfVar62[1] * pfVar38[1];
                auVar187._8_4_ = pfVar62[2] * pfVar38[2];
                auVar187._12_4_ = pfVar62[3] * pfVar38[3];
                auVar187._16_4_ = pfVar62[lVar48 + 4] * pfVar38[4];
                auVar187._20_4_ = pfVar62[lVar48 + 5] * pfVar38[5];
                auVar187._28_36_ = in_ZMM4._28_36_;
                auVar187._24_4_ = pfVar62[lVar48 + 6] * pfVar38[6];
                fVar205 = auVar187._0_4_ + fVar205;
                fVar206 = auVar187._4_4_ + fVar206;
                fVar154 = auVar187._8_4_ + fVar154;
                fVar202 = auVar187._12_4_ + fVar202;
                fVar207 = auVar187._16_4_ + fVar207;
                fVar208 = auVar187._20_4_ + fVar208;
                fVar148 = auVar187._24_4_ + fVar148;
                fVar152 = in_ZMM4._28_4_ + fVar152;
                fVar155 = *pfVar62 * pfVar38[8] + fVar155;
                fVar156 = pfVar62[1] * pfVar38[9] + fVar156;
                fVar203 = pfVar62[2] * pfVar38[10] + fVar203;
                fVar204 = pfVar62[3] * pfVar38[0xb] + fVar204;
                fVar157 = pfVar62[lVar48 + 4] * pfVar38[0xc] + fVar157;
                fVar158 = pfVar62[lVar48 + 5] * pfVar38[0xd] + fVar158;
                fVar96 = pfVar62[lVar48 + 6] * pfVar38[0xe] + fVar96;
                fVar97 = pfVar62[lVar48 + 7] + fVar97;
                uVar35 = (ulong)((int)uVar35 - 1);
                pfVar38 = pfVar38 + 0x10;
                pfVar62 = pfVar62 + lVar42;
                in_ZMM4 = ZEXT3264(auVar187._0_32_);
              }
              pfVar69 = pfVar69 + uVar73 * 0x10;
              pfVar37 = (float *)((long)pfVar37 + lVar58);
            }
            if (iVar7 == 1) {
              pfVar38 = pfVar69 + 8;
              uVar35 = uVar73;
              while (iVar55 = (int)uVar35, uVar35 = (ulong)(iVar55 - 1), iVar55 != 0) {
                auVar173 = vinsertps_avx(ZEXT416((uint)*pfVar37),ZEXT416((uint)pfVar37[lVar48]),0x10
                                        );
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar37[iVar23]),0x20);
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar37[iVar8]),0x30);
                auVar121 = vinsertps_avx(ZEXT416((uint)pfVar37[iVar27]),
                                         ZEXT416((uint)pfVar37[iVar18]),0x10);
                auVar121 = vinsertps_avx(auVar121,ZEXT416((uint)pfVar37[iVar28]),0x20);
                auVar121 = vinsertps_avx(auVar121,ZEXT416((uint)pfVar37[iVar39]),0x30);
                fVar196 = auVar173._0_4_ * pfVar38[-8];
                fVar197 = auVar173._4_4_ * pfVar38[-7];
                fVar80 = auVar173._8_4_ * pfVar38[-6];
                fVar95 = auVar173._12_4_ * pfVar38[-5];
                fVar98 = auVar121._0_4_ * pfVar38[-4];
                fVar99 = auVar121._4_4_ * pfVar38[-3];
                fVar100 = auVar121._8_4_ * pfVar38[-2];
                in_ZMM4 = ZEXT2864(CONCAT424(fVar100,CONCAT420(fVar99,CONCAT416(fVar98,CONCAT412(
                                                  fVar95,CONCAT48(fVar80,CONCAT44(fVar197,fVar196)))
                                                  ))));
                fVar205 = fVar196 + fVar205;
                fVar206 = fVar197 + fVar206;
                fVar154 = fVar80 + fVar154;
                fVar202 = fVar95 + fVar202;
                fVar207 = fVar98 + fVar207;
                fVar208 = fVar99 + fVar208;
                fVar148 = fVar100 + fVar148;
                fVar152 = fVar152 + 0.0;
                fVar155 = auVar173._0_4_ * *pfVar38 + fVar155;
                fVar156 = auVar173._4_4_ * pfVar38[1] + fVar156;
                fVar203 = auVar173._8_4_ * pfVar38[2] + fVar203;
                fVar204 = auVar173._12_4_ * pfVar38[3] + fVar204;
                fVar157 = auVar121._0_4_ * pfVar38[4] + fVar157;
                fVar158 = auVar121._4_4_ * pfVar38[5] + fVar158;
                fVar96 = auVar121._8_4_ * pfVar38[6] + fVar96;
                fVar97 = auVar121._12_4_ + fVar97;
                pfVar38 = pfVar38 + 0x10;
                pfVar37 = pfVar37 + lVar49;
              }
              pfVar69 = pfVar69 + uVar73 * 0x10;
            }
            uVar61 = uVar61 + 8;
            lVar47 = lVar47 + lVar34 * 8;
            pfVar33 = pfVar33 + lVar34 * 2;
          }
          auVar85._0_4_ = fVar207 + fVar205;
          auVar85._4_4_ = fVar208 + fVar206;
          auVar85._8_4_ = fVar148 + fVar154;
          auVar85._12_4_ = fVar152 + fVar202;
          auVar173 = vshufpd_avx(auVar85,auVar85,1);
          auVar86._0_4_ = auVar173._0_4_ + auVar85._0_4_;
          auVar86._4_4_ = auVar173._4_4_ + auVar85._4_4_;
          auVar86._8_4_ = auVar173._8_4_ + auVar85._8_4_;
          auVar86._12_4_ = auVar173._12_4_ + auVar85._12_4_;
          auVar103._0_4_ = fVar157 + fVar155;
          auVar103._4_4_ = fVar158 + fVar156;
          auVar103._8_4_ = fVar96 + fVar203;
          auVar103._12_4_ = fVar97 + fVar204;
          auVar173 = vshufpd_avx(auVar103,auVar103,1);
          auVar104._0_4_ = auVar173._0_4_ + auVar103._0_4_;
          auVar104._4_4_ = auVar173._4_4_ + auVar103._4_4_;
          auVar104._8_4_ = auVar173._8_4_ + auVar103._8_4_;
          auVar104._12_4_ = auVar173._12_4_ + auVar103._12_4_;
          auVar79 = ZEXT864(0) << 0x40;
          auVar186 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar61 | 3) < local_1f8; uVar61 = uVar61 + 4) {
            lVar36 = (int)((long)((ulong)(uint)((int)(uint)uVar61 >> 0x1f) << 0x20 |
                                 uVar61 & 0xffffffff) / (long)iVar7) * lVar34;
            if (iVar7 == 4) {
              pfVar37 = (float *)((long)local_88.data + lVar36 + (long)iVar51 * 4);
              uVar35 = uVar73;
              pfVar38 = pfVar69;
              while (iVar55 = (int)uVar35, uVar35 = (ulong)(iVar55 - 1), iVar55 != 0) {
                auVar79 = ZEXT1664(CONCAT412(pfVar37[3] * pfVar38[3] + auVar79._12_4_,
                                             CONCAT48(pfVar37[2] * pfVar38[2] + auVar79._8_4_,
                                                      CONCAT44(pfVar37[1] * pfVar38[1] +
                                                               auVar79._4_4_,
                                                               *pfVar37 * *pfVar38 + auVar79._0_4_))
                                            ));
                auVar186 = ZEXT1664(CONCAT412(pfVar37[3] * pfVar38[7] + auVar186._12_4_,
                                              CONCAT48(pfVar37[2] * pfVar38[6] + auVar186._8_4_,
                                                       CONCAT44(pfVar37[1] * pfVar38[5] +
                                                                auVar186._4_4_,
                                                                *pfVar37 * pfVar38[4] +
                                                                auVar186._0_4_))));
                pfVar38 = pfVar38 + 8;
                pfVar37 = pfVar37 + lVar42;
              }
              pfVar69 = pfVar69 + uVar73 * 8;
            }
            else {
              pfVar37 = (float *)((long)local_88.data + lVar36 + (long)iVar29 * 4);
            }
            uVar35 = uVar73;
            pfVar38 = pfVar69;
            if (iVar7 == 1) {
              while ((int)uVar35 != 0) {
                auVar173 = vinsertps_avx(ZEXT416((uint)*pfVar37),ZEXT416((uint)pfVar37[lVar48]),0x10
                                        );
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar37[iVar23]),0x20);
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar37[iVar8]),0x30);
                auVar79 = ZEXT1664(CONCAT412(auVar173._12_4_ * pfVar38[3] + auVar79._12_4_,
                                             CONCAT48(auVar173._8_4_ * pfVar38[2] + auVar79._8_4_,
                                                      CONCAT44(auVar173._4_4_ * pfVar38[1] +
                                                               auVar79._4_4_,
                                                               auVar173._0_4_ * *pfVar38 +
                                                               auVar79._0_4_))));
                auVar186 = ZEXT1664(CONCAT412(auVar173._12_4_ * pfVar38[7] + auVar186._12_4_,
                                              CONCAT48(auVar173._8_4_ * pfVar38[6] + auVar186._8_4_,
                                                       CONCAT44(auVar173._4_4_ * pfVar38[5] +
                                                                auVar186._4_4_,
                                                                auVar173._0_4_ * pfVar38[4] +
                                                                auVar186._0_4_))));
                pfVar37 = pfVar37 + lVar49;
                uVar35 = (ulong)((int)uVar35 - 1);
                pfVar38 = pfVar38 + 8;
              }
              pfVar69 = pfVar69 + uVar73 * 8;
            }
            lVar47 = lVar47 + lVar34 * 4;
            pfVar33 = pfVar33 + lVar34;
          }
          auVar173 = vshufpd_avx(auVar79._0_16_,auVar79._0_16_,1);
          auVar126._0_4_ = auVar173._0_4_ + auVar79._0_4_;
          auVar126._4_4_ = auVar173._4_4_ + auVar79._4_4_;
          auVar126._8_4_ = auVar173._8_4_ + auVar79._8_4_;
          auVar126._12_4_ = auVar173._12_4_ + auVar79._12_4_;
          auVar173 = vshufpd_avx(auVar186._0_16_,auVar186._0_16_,1);
          auVar144._0_4_ = auVar173._0_4_ + auVar186._0_4_;
          auVar144._4_4_ = auVar173._4_4_ + auVar186._4_4_;
          auVar144._8_4_ = auVar173._8_4_ + auVar186._8_4_;
          auVar144._12_4_ = auVar173._12_4_ + auVar186._12_4_;
          in_ZMM4 = ZEXT1664(auVar144);
          auVar173 = vinsertps_avx(auVar104,auVar86,0x4c);
          auVar121 = vinsertps_avx(auVar86,auVar104,0x1c);
          auVar137 = vinsertps_avx(auVar144,auVar126,0x4c);
          auVar138 = vinsertps_avx(auVar126,auVar144,0x1c);
          auVar79 = ZEXT1664(CONCAT412(auVar173._12_4_ + 0.0 + auVar121._12_4_ +
                                       auVar137._12_4_ + auVar138._12_4_,
                                       CONCAT48(auVar173._8_4_ + 0.0 + auVar121._8_4_ +
                                                auVar137._8_4_ + auVar138._8_4_,
                                                CONCAT44(auVar173._4_4_ + fVar153 + auVar121._4_4_ +
                                                         auVar137._4_4_ + auVar138._4_4_,
                                                         auVar173._0_4_ + fVar209 + auVar121._0_4_ +
                                                         auVar137._0_4_ + auVar138._0_4_))));
          for (; (long)(uVar61 | 1) < lVar63; uVar61 = uVar61 + 2) {
            lVar36 = 0;
            uVar35 = uVar73;
            pfVar37 = pfVar69;
            while (iVar29 = (int)uVar35, uVar35 = (ulong)(iVar29 - 1), iVar29 != 0) {
              fVar209 = *(float *)((long)pfVar33 + lVar36);
              fVar153 = *(float *)(lVar47 + lVar36);
              auVar79 = ZEXT1664(CONCAT412(fVar209 * 0.0 + auVar79._12_4_ + fVar153 * 0.0,
                                           CONCAT48(fVar209 * 0.0 + auVar79._8_4_ + fVar153 * 0.0,
                                                    CONCAT44((float)((ulong)*(undefined8 *)pfVar37
                                                                    >> 0x20) * fVar209 +
                                                             auVar79._4_4_ +
                                                             (float)((ulong)*(undefined8 *)
                                                                             (pfVar37 + 2) >> 0x20)
                                                             * fVar153,
                                                             (float)*(undefined8 *)pfVar37 * fVar209
                                                             + auVar79._0_4_ +
                                                             (float)*(undefined8 *)(pfVar37 + 2) *
                                                             fVar153))));
              pfVar37 = pfVar37 + 4;
              lVar36 = lVar36 + lVar50;
            }
            pfVar69 = pfVar69 + uVar73 * 4;
            lVar47 = lVar47 + lVar34 * 2;
            pfVar33 = (float *)((long)pfVar33 + lVar34 * 2);
          }
          for (; auVar146 = auVar79._0_16_, (long)uVar61 < lVar63; uVar61 = uVar61 + 1) {
            pfVar37 = pfVar33;
            for (lVar47 = 0; iVar72 != (int)lVar47; lVar47 = lVar47 + 1) {
              fVar209 = *pfVar37;
              auVar79 = ZEXT1664(CONCAT412(fVar209 * 0.0 + auVar79._12_4_,
                                           CONCAT48(fVar209 * 0.0 + auVar79._8_4_,
                                                    CONCAT44((float)((ulong)*(undefined8 *)
                                                                             (pfVar69 + lVar47 * 2)
                                                                    >> 0x20) * fVar209 +
                                                             auVar79._4_4_,
                                                             (float)*(undefined8 *)
                                                                     (pfVar69 + lVar47 * 2) *
                                                             fVar209 + auVar79._0_4_))));
              pfVar37 = pfVar37 + lVar49;
            }
            pfVar69 = pfVar69 + uVar73 * 2;
            pfVar33 = (float *)((long)pfVar33 + lVar34);
          }
          if (5 < iVar10 - 1U) goto LAB_004a28de;
          auVar173 = vmovshdup_avx(auVar146);
          fVar209 = auVar79._0_4_;
          fVar153 = auVar173._0_4_;
          switch(iVar10) {
          case 1:
            auVar146 = vmaxps_avx(auVar146,_DAT_004eb480);
            break;
          case 2:
            auVar173 = vcmpps_avx(ZEXT816(0) << 0x40,auVar146,1);
            fVar153 = *pfVar54;
            auVar88._4_4_ = fVar153;
            auVar88._0_4_ = fVar153;
            auVar88._8_4_ = fVar153;
            auVar88._12_4_ = fVar153;
            auVar106._8_4_ = 0x3f800000;
            auVar106._0_8_ = 0x3f8000003f800000;
            auVar106._12_4_ = 0x3f800000;
            auVar173 = vblendvps_avx(auVar88,auVar106,auVar173);
            goto LAB_004a28cc;
          case 3:
            auVar74._8_8_ = 0;
            auVar74._0_8_ = *(ulong *)pfVar54;
            auVar138 = vmaxss_avx(auVar74,auVar146);
            auVar121 = vinsertps_avx(auVar74,auVar138,0x10);
            auVar137 = vinsertps_avx(auVar173,auVar74,0x50);
            auVar121 = vcmpps_avx(auVar137,auVar121,1);
            auVar173 = vinsertps_avx(auVar173,auVar138,0x10);
            auVar173 = vblendvps_avx(auVar173,auVar74,auVar121);
            auVar146 = vshufps_avx(auVar173,auVar173,0xe1);
            auVar173 = vcmpps_avx(auVar74,auVar146,1);
            if ((auVar173 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar146 = vinsertps_avx(auVar146,auVar74,0x50);
            }
            break;
          case 4:
            auVar127._8_4_ = 0x42b0c0a5;
            auVar127._0_8_ = 0x42b0c0a542b0c0a5;
            auVar127._12_4_ = 0x42b0c0a5;
            auVar121 = vminps_avx(auVar146,auVar127);
            auVar87._8_4_ = 0xc2b0c0a5;
            auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar87._12_4_ = 0xc2b0c0a5;
            auVar173 = vcmpps_avx(auVar121,auVar87,1);
            auVar75._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
            auVar75._8_4_ = auVar121._8_4_ ^ 0x80000000;
            auVar75._12_4_ = auVar121._12_4_ ^ 0x80000000;
            auVar173 = vblendvps_avx(auVar75,auVar127,auVar173);
            in_ZMM4 = ZEXT1664(auVar144);
            local_1c8._0_4_ = expf(auVar173._0_4_);
            local_1c8._4_4_ = extraout_XMM0_Db_00;
            local_1c8._8_4_ = extraout_XMM0_Dc_00;
            local_1c8._12_4_ = extraout_XMM0_Dd_00;
            auVar173 = vmovshdup_avx(auVar173);
            auVar79._0_4_ = expf(auVar173._0_4_);
            auVar79._4_60_ = extraout_var_00;
            auVar173 = vinsertps_avx(local_1c8,auVar79._0_16_,0x10);
            auVar105._8_4_ = 0x3f800000;
            auVar105._0_8_ = 0x3f8000003f800000;
            auVar105._12_4_ = 0x3f800000;
            auVar76._0_4_ = auVar173._0_4_ + 1.0;
            auVar76._4_4_ = auVar173._4_4_ + 1.0;
            auVar76._8_4_ = auVar173._8_4_ + 1.0;
            auVar76._12_4_ = auVar173._12_4_ + 1.0;
            auVar173 = vrcpps_avx(auVar76);
            fVar209 = auVar173._0_4_;
            auVar77._0_4_ = auVar76._0_4_ * fVar209;
            fVar153 = auVar173._4_4_;
            auVar77._4_4_ = auVar76._4_4_ * fVar153;
            fVar154 = auVar173._8_4_;
            auVar77._8_4_ = auVar76._8_4_ * fVar154;
            fVar202 = auVar173._12_4_;
            auVar77._12_4_ = auVar76._12_4_ * fVar202;
            auVar173 = vsubps_avx(auVar105,auVar77);
            auVar146._0_4_ = fVar209 + fVar209 * auVar173._0_4_;
            auVar146._4_4_ = fVar153 + fVar153 * auVar173._4_4_;
            auVar146._8_4_ = fVar154 + fVar154 * auVar173._8_4_;
            auVar146._12_4_ = fVar202 + fVar202 * auVar173._12_4_;
            break;
          case 5:
            in_ZMM4 = ZEXT1664(auVar144);
            fVar154 = expf(fVar209);
            fVar154 = logf(fVar154 + 1.0);
            local_1b8._0_4_ = tanhf(fVar154);
            local_1b8._4_4_ = extraout_XMM0_Db;
            local_1b8._8_4_ = extraout_XMM0_Dc;
            local_1b8._12_4_ = extraout_XMM0_Dd;
            fVar153 = expf(fVar153);
            fVar153 = logf(fVar153 + 1.0);
            auVar186._0_4_ = tanhf(fVar153);
            auVar186._4_60_ = extraout_var;
            auVar173 = vinsertps_avx(local_1b8,auVar186._0_16_,0x10);
LAB_004a28cc:
            auVar146._0_4_ = auVar173._0_4_ * fVar209;
            auVar146._4_4_ = auVar173._4_4_ * auVar79._4_4_;
            auVar146._8_4_ = auVar173._8_4_ * auVar79._8_4_;
            auVar146._12_4_ = auVar173._12_4_ * auVar79._12_4_;
            break;
          case 6:
            fVar154 = *pfVar54;
            fVar202 = pfVar54[1];
            fVar203 = -fVar202 / fVar154;
            auVar173 = SUB6416(ZEXT464(0),0) << 0x20;
            if ((fVar203 <= fVar209) && (auVar173 = auVar146, fVar209 <= fVar203 + 1.0 / fVar154)) {
              auVar173 = ZEXT416((uint)((fVar154 * fVar209 + fVar202) * fVar209));
            }
            if (fVar203 <= fVar153) {
              in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),1.0 / fVar154));
              auVar146._4_12_ = auVar79._4_12_;
              auVar146._0_4_ = (float)auVar173._0_4_;
              if (fVar153 <= fVar203 + 1.0 / fVar154) {
                auVar146 = vinsertps_avx(auVar146,ZEXT416((uint)((fVar154 * fVar153 + fVar202) *
                                                                fVar153)),0x10);
              }
            }
            else {
              auVar146 = vblendps_avx(auVar173,_DAT_004eb480,0xe);
            }
          }
LAB_004a28de:
          *puVar67 = auVar146._0_4_;
          uVar11 = vextractps_avx(auVar146,1);
          *puVar71 = uVar11;
          puVar67 = puVar67 + 1;
          puVar71 = puVar71 + 1;
          iVar51 = iVar51 + iVar40;
          lVar43 = lVar43 + lVar1;
          lVar32 = lVar32 + lVar1;
        }
      }
      lVar41 = lVar41 * lVar56;
      pvVar13 = top_blob->data;
      iVar40 = top_blob->w;
      sVar14 = top_blob->elemsize;
      local_198 = 0;
      uVar31 = 0;
      if (0 < (int)local_38) {
        uVar31 = local_38 & 0xffffffff;
      }
      for (uVar64 = (ulong)(iVar52 + iVar53 * 2); (long)uVar64 < (long)uVar30; uVar64 = uVar64 + 1)
      {
        uVar46 = (int)uVar64 >> 0x1f;
        uVar57 = (ulong)uVar46 << 0x20 | uVar64 & 0xffffffff;
        sVar15 = (this->weight_data_tm).cstep;
        sVar17 = (this->weight_data_tm).elemsize;
        pfVar69 = (float *)((long)iVar40 * sVar14 * uVar64 + (long)pvVar13);
        pvVar16 = (this->weight_data_tm).data;
        pfVar54 = *(float **)(&this->field_0xf8 + (long)p_Var12);
        lVar63 = 0;
        iVar53 = 0;
        lVar56 = lVar48 * 4;
        for (uVar70 = 0; uVar70 != uVar31; uVar70 = uVar70 + 1) {
          if (lVar60 == 0) {
            fVar209 = 0.0;
          }
          else {
            fVar209 = *(float *)(lVar60 + uVar64 * 4);
          }
          iVar52 = iVar9 * iVar7 * (int)uVar70;
          lVar43 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar65 = (long)local_88.data + lVar56;
          pfVar37 = (float *)((long)local_88.data + lVar63);
          fVar153 = 0.0;
          fVar154 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          fVar204 = 0.0;
          fVar205 = 0.0;
          fVar206 = 0.0;
          fVar207 = 0.0;
          uVar59 = 0;
          pfVar33 = (float *)((long)((int)((long)((ulong)uVar46 << 0x20 | uVar64 & 0xffffffff) % 2)
                                     + (int)((long)uVar57 / 8) +
                                     (int)(char)((char)((long)uVar57 % 8) / '\x04') +
                                    (int)(char)((char)((long)((ulong)uVar46 << 0x20 |
                                                             uVar64 & 0xffffffff) % 4) / '\x02')) *
                              sVar15 * sVar17 + (long)pvVar16);
          while( true ) {
            local_138 = (int)lVar41;
            if (local_138 <= (int)((uint)uVar59 | 7)) break;
            lVar32 = (int)((long)((ulong)(uint)((int)(uint)uVar59 >> 0x1f) << 0x20 |
                                 uVar59 & 0xffffffff) / (long)iVar7) * lVar43;
            if (iVar7 == 8) {
              pfVar38 = (float *)((long)local_88.data + lVar32 + (long)iVar53 * 4);
              uVar66 = uVar73;
              pfVar62 = pfVar33;
              while (iVar51 = (int)uVar66, uVar66 = (ulong)(iVar51 - 1), iVar51 != 0) {
                fVar202 = *pfVar62 * *pfVar38 + fVar202;
                fVar203 = pfVar62[1] * pfVar38[1] + fVar203;
                fVar153 = pfVar62[2] * pfVar38[2] + fVar153;
                fVar154 = pfVar62[3] * pfVar38[3] + fVar154;
                fVar204 = pfVar62[4] * pfVar38[4] + fVar204;
                fVar205 = pfVar62[5] * pfVar38[5] + fVar205;
                fVar206 = pfVar62[6] * pfVar38[6] + fVar206;
                fVar207 = pfVar62[7] + fVar207;
                pfVar62 = pfVar62 + 8;
                pfVar38 = pfVar38 + iVar26;
              }
              pfVar33 = pfVar33 + uVar73 * 8;
            }
            else {
              pfVar38 = (float *)((long)local_88.data + lVar32 + (long)iVar52 * 4);
            }
            uVar66 = uVar73;
            pfVar62 = pfVar38;
            pfVar68 = pfVar33;
            if (iVar7 == 4) {
              while ((int)uVar66 != 0) {
                fVar202 = *pfVar62 * *pfVar68 + fVar202;
                fVar203 = pfVar62[1] * pfVar68[1] + fVar203;
                fVar153 = pfVar62[2] * pfVar68[2] + fVar153;
                fVar154 = pfVar62[3] * pfVar68[3] + fVar154;
                fVar204 = pfVar62[lVar48 + 4] * pfVar68[4] + fVar204;
                fVar205 = pfVar62[lVar48 + 5] * pfVar68[5] + fVar205;
                fVar206 = pfVar62[lVar48 + 6] * pfVar68[6] + fVar206;
                fVar207 = pfVar62[lVar48 + 7] + fVar207;
                uVar66 = (ulong)((int)uVar66 - 1);
                pfVar62 = pfVar62 + lVar42;
                pfVar68 = pfVar68 + 8;
              }
              pfVar33 = pfVar33 + uVar73 * 8;
              pfVar38 = (float *)((long)pfVar38 + lVar58);
            }
            uVar66 = uVar73;
            pfVar62 = pfVar33;
            if (iVar7 == 1) {
              while ((int)uVar66 != 0) {
                auVar173 = vinsertps_avx(ZEXT416((uint)*pfVar38),ZEXT416((uint)pfVar38[lVar48]),0x10
                                        );
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar38[iVar23]),0x20);
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar38[iVar8]),0x30);
                auVar121 = vinsertps_avx(ZEXT416((uint)pfVar38[iVar27]),
                                         ZEXT416((uint)pfVar38[iVar18]),0x10);
                auVar121 = vinsertps_avx(auVar121,ZEXT416((uint)pfVar38[iVar28]),0x20);
                auVar121 = vinsertps_avx(auVar121,ZEXT416((uint)pfVar38[iVar39]),0x30);
                fVar202 = auVar173._0_4_ * *pfVar62 + fVar202;
                fVar203 = auVar173._4_4_ * pfVar62[1] + fVar203;
                fVar153 = auVar173._8_4_ * pfVar62[2] + fVar153;
                fVar154 = auVar173._12_4_ * pfVar62[3] + fVar154;
                fVar204 = auVar121._0_4_ * pfVar62[4] + fVar204;
                fVar205 = auVar121._4_4_ * pfVar62[5] + fVar205;
                fVar206 = auVar121._8_4_ * pfVar62[6] + fVar206;
                fVar207 = auVar121._12_4_ + fVar207;
                pfVar38 = pfVar38 + lVar49;
                uVar66 = (ulong)((int)uVar66 - 1);
                pfVar62 = pfVar62 + 8;
              }
              pfVar33 = pfVar33 + uVar73 * 8;
            }
            uVar59 = uVar59 + 8;
            lVar65 = lVar65 + lVar43 * 8;
            pfVar37 = pfVar37 + lVar43 * 2;
          }
          auVar89._0_4_ = fVar204 + fVar202;
          auVar89._4_4_ = fVar205 + fVar203;
          auVar89._8_4_ = fVar206 + fVar153;
          auVar89._12_4_ = fVar207 + fVar154;
          auVar173 = vshufpd_avx(auVar89,auVar89,1);
          auVar90._0_4_ = auVar173._0_4_ + auVar89._0_4_;
          auVar90._4_4_ = auVar173._4_4_ + auVar89._4_4_;
          auVar90._8_4_ = auVar173._8_4_ + auVar89._8_4_;
          auVar90._12_4_ = auVar173._12_4_ + auVar89._12_4_;
          auVar79 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar59 | 3) < local_138; uVar59 = uVar59 + 4) {
            lVar32 = (int)((long)((ulong)(uint)((int)(uint)uVar59 >> 0x1f) << 0x20 |
                                 uVar59 & 0xffffffff) / (long)iVar7) * lVar43;
            if (iVar7 == 4) {
              pfVar38 = (float *)((long)local_88.data + lVar32 + (long)iVar53 * 4);
              uVar66 = uVar73;
              pfVar62 = pfVar33;
              while (iVar51 = (int)uVar66, uVar66 = (ulong)(iVar51 - 1), iVar51 != 0) {
                auVar79 = ZEXT1664(CONCAT412(pfVar62[3] * pfVar38[3] + auVar79._12_4_,
                                             CONCAT48(pfVar62[2] * pfVar38[2] + auVar79._8_4_,
                                                      CONCAT44(pfVar62[1] * pfVar38[1] +
                                                               auVar79._4_4_,
                                                               *pfVar62 * *pfVar38 + auVar79._0_4_))
                                            ));
                pfVar62 = pfVar62 + 4;
                pfVar38 = pfVar38 + lVar42;
              }
              pfVar33 = pfVar33 + uVar73 * 4;
            }
            else {
              pfVar38 = (float *)((long)local_88.data + lVar32 + (long)iVar52 * 4);
            }
            uVar66 = uVar73;
            pfVar62 = pfVar33;
            if (iVar7 == 1) {
              while ((int)uVar66 != 0) {
                auVar173 = vinsertps_avx(ZEXT416((uint)*pfVar38),ZEXT416((uint)pfVar38[lVar48]),0x10
                                        );
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar38[iVar23]),0x20);
                auVar173 = vinsertps_avx(auVar173,ZEXT416((uint)pfVar38[iVar8]),0x30);
                auVar79 = ZEXT1664(CONCAT412(auVar173._12_4_ * pfVar62[3] + auVar79._12_4_,
                                             CONCAT48(auVar173._8_4_ * pfVar62[2] + auVar79._8_4_,
                                                      CONCAT44(auVar173._4_4_ * pfVar62[1] +
                                                               auVar79._4_4_,
                                                               auVar173._0_4_ * *pfVar62 +
                                                               auVar79._0_4_))));
                pfVar38 = pfVar38 + lVar49;
                uVar66 = (ulong)((int)uVar66 - 1);
                pfVar62 = pfVar62 + 4;
              }
              pfVar33 = pfVar33 + uVar73 * 4;
            }
            lVar65 = lVar65 + lVar43 * 4;
            pfVar37 = pfVar37 + lVar43;
          }
          auVar173 = vmovshdup_avx(auVar90);
          auVar121 = vshufpd_avx(auVar79._0_16_,auVar79._0_16_,1);
          auVar107._0_4_ = auVar121._0_4_ + auVar79._0_4_;
          auVar107._4_4_ = auVar121._4_4_ + auVar79._4_4_;
          auVar107._8_4_ = auVar121._8_4_ + auVar79._8_4_;
          auVar107._12_4_ = auVar121._12_4_ + auVar79._12_4_;
          auVar121 = vmovshdup_avx(auVar107);
          auVar79 = ZEXT464((uint)(auVar173._0_4_ + fVar209 + auVar90._0_4_ +
                                  auVar121._0_4_ + auVar107._0_4_));
          for (; (long)(uVar59 | 1) < lVar41; uVar59 = uVar59 + 2) {
            lVar32 = 0;
            for (lVar47 = 0; iVar72 != (int)lVar47; lVar47 = lVar47 + 1) {
              auVar79 = ZEXT464((uint)(pfVar33[lVar47 * 2] * *(float *)((long)pfVar37 + lVar32) +
                                       auVar79._0_4_ +
                                      pfVar33[lVar47 * 2 + 1] * *(float *)(lVar65 + lVar32)));
              lVar32 = lVar32 + lVar50;
            }
            pfVar33 = pfVar33 + uVar73 * 2;
            lVar65 = lVar65 + lVar43 * 2;
            pfVar37 = (float *)((long)pfVar37 + lVar43 * 2);
          }
          for (; (long)uVar59 < lVar41; uVar59 = uVar59 + 1) {
            pfVar38 = pfVar37;
            for (lVar65 = 0; iVar72 != (int)lVar65; lVar65 = lVar65 + 1) {
              auVar79 = ZEXT464((uint)(pfVar33[lVar65] * *pfVar38 + auVar79._0_4_));
              pfVar38 = pfVar38 + lVar49;
            }
            pfVar33 = pfVar33 + uVar73;
            pfVar37 = (float *)((long)pfVar37 + lVar43);
          }
          auVar173 = auVar79._0_16_;
          fVar153 = auVar79._0_4_;
          fVar209 = fVar153;
          switch(iVar10) {
          case 1:
            auVar173 = vmaxss_avx(auVar173,ZEXT416(0));
            fVar209 = auVar173._0_4_;
            break;
          case 2:
            auVar173 = vcmpss_avx(ZEXT416(0) << 0x20,auVar173,1);
            auVar109._8_4_ = 0x3f800000;
            auVar109._0_8_ = 0x3f8000003f800000;
            auVar109._12_4_ = 0x3f800000;
            auVar173 = vblendvps_avx(ZEXT416((uint)*pfVar54),auVar109,auVar173);
            fVar209 = auVar173._0_4_ * fVar153;
            break;
          case 3:
            auVar173 = vmaxss_avx(auVar173,ZEXT416((uint)*pfVar54));
            fVar209 = auVar173._0_4_;
            if (pfVar54[1] < auVar173._0_4_) {
              fVar209 = pfVar54[1];
            }
            break;
          case 4:
            auVar173 = vminss_avx(auVar173,ZEXT416(0x42b0c0a5));
            auVar91._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
            auVar91._8_4_ = auVar173._8_4_ ^ 0x80000000;
            auVar91._12_4_ = auVar173._12_4_ ^ 0x80000000;
            auVar173 = vcmpss_avx(auVar173,ZEXT416(0xc2b0c0a5),1);
            auVar108._8_4_ = 0x42b0c0a5;
            auVar108._0_8_ = 0x42b0c0a542b0c0a5;
            auVar108._12_4_ = 0x42b0c0a5;
            auVar173 = vblendvps_avx(auVar91,auVar108,auVar173);
            fVar209 = expf(auVar173._0_4_);
            fVar209 = 1.0 / (fVar209 + 1.0);
            break;
          case 5:
            fVar209 = expf(fVar153);
            fVar209 = logf(fVar209 + 1.0);
            fVar209 = tanhf(fVar209);
            fVar209 = fVar209 * fVar153;
            break;
          case 6:
            fVar154 = *pfVar54;
            fVar202 = -pfVar54[1] / fVar154;
            fVar209 = 0.0;
            if ((fVar202 <= fVar153) && (fVar209 = fVar153, fVar153 <= fVar202 + 1.0 / fVar154)) {
              fVar209 = (fVar154 * fVar153 + pfVar54[1]) * fVar153;
            }
          }
          *pfVar69 = fVar209;
          pfVar69 = pfVar69 + 1;
          iVar53 = iVar53 + iVar9 * iVar7;
          lVar56 = lVar56 + lVar1;
          lVar63 = lVar63 + lVar1;
        }
      }
    }
  }
  piVar24 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar24 != (int *)0x0) {
    LOCK();
    *piVar24 = *piVar24 + -1;
    UNLOCK();
    if (*piVar24 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        free(local_88.data);
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_198;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}